

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  bool bVar22;
  LinearSpace3fa *pLVar23;
  byte bVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar30;
  bool bVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar67 [16];
  undefined1 auVar101 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float t1;
  undefined4 uVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vfloat4 b0;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vfloat4 b0_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar172;
  vfloat4 a0_3;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  vfloat4 a0_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar181 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar219;
  float fVar220;
  vfloat4 a0_1;
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  LinearSpace3fa *local_368;
  ulong local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  
  uVar32 = (ulong)(byte)prim[1];
  fVar172 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar76 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar38 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  fVar135 = fVar172 * auVar38._0_4_;
  fVar117 = fVar172 * auVar76._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar32 * 4 + 6);
  auVar89 = vpmovsxbd_avx2(auVar12);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar32 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar37);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar32 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar45);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar44);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar32 * 0xc + 6);
  auVar90 = vpmovsxbd_avx2(auVar43);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar32 * 0xd + 6);
  auVar88 = vpmovsxbd_avx2(auVar56);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar32 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar5);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar32 * 0x13 + 6);
  auVar93 = vpmovsxbd_avx2(auVar42);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar32 * 0x14 + 6);
  auVar84 = vpmovsxbd_avx2(auVar41);
  auVar92 = vcvtdq2ps_avx(auVar84);
  auVar103._4_4_ = fVar117;
  auVar103._0_4_ = fVar117;
  auVar103._8_4_ = fVar117;
  auVar103._12_4_ = fVar117;
  auVar103._16_4_ = fVar117;
  auVar103._20_4_ = fVar117;
  auVar103._24_4_ = fVar117;
  auVar103._28_4_ = fVar117;
  auVar149._8_4_ = 1;
  auVar149._0_8_ = 0x100000001;
  auVar149._12_4_ = 1;
  auVar149._16_4_ = 1;
  auVar149._20_4_ = 1;
  auVar149._24_4_ = 1;
  auVar149._28_4_ = 1;
  auVar94 = ZEXT1632(CONCAT412(fVar172 * auVar76._12_4_,
                               CONCAT48(fVar172 * auVar76._8_4_,
                                        CONCAT44(fVar172 * auVar76._4_4_,fVar117))));
  auVar85 = vpermps_avx2(auVar149,auVar94);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar241 = ZEXT3264(auVar82);
  auVar83 = vpermps_avx512vl(auVar82,auVar94);
  fVar117 = auVar83._0_4_;
  fVar197 = auVar83._4_4_;
  auVar94._4_4_ = fVar197 * auVar87._4_4_;
  auVar94._0_4_ = fVar117 * auVar87._0_4_;
  fVar207 = auVar83._8_4_;
  auVar94._8_4_ = fVar207 * auVar87._8_4_;
  fVar209 = auVar83._12_4_;
  auVar94._12_4_ = fVar209 * auVar87._12_4_;
  fVar122 = auVar83._16_4_;
  auVar94._16_4_ = fVar122 * auVar87._16_4_;
  fVar123 = auVar83._20_4_;
  auVar94._20_4_ = fVar123 * auVar87._20_4_;
  fVar124 = auVar83._24_4_;
  auVar94._24_4_ = fVar124 * auVar87._24_4_;
  auVar94._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar88._4_4_ * fVar197;
  auVar93._0_4_ = auVar88._0_4_ * fVar117;
  auVar93._8_4_ = auVar88._8_4_ * fVar207;
  auVar93._12_4_ = auVar88._12_4_ * fVar209;
  auVar93._16_4_ = auVar88._16_4_ * fVar122;
  auVar93._20_4_ = auVar88._20_4_ * fVar123;
  auVar93._24_4_ = auVar88._24_4_ * fVar124;
  auVar93._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar92._4_4_ * fVar197;
  auVar84._0_4_ = auVar92._0_4_ * fVar117;
  auVar84._8_4_ = auVar92._8_4_ * fVar207;
  auVar84._12_4_ = auVar92._12_4_ * fVar209;
  auVar84._16_4_ = auVar92._16_4_ * fVar122;
  auVar84._20_4_ = auVar92._20_4_ * fVar123;
  auVar84._24_4_ = auVar92._24_4_ * fVar124;
  auVar84._28_4_ = auVar83._28_4_;
  auVar12 = vfmadd231ps_fma(auVar94,auVar85,auVar86);
  auVar37 = vfmadd231ps_fma(auVar93,auVar85,auVar90);
  auVar45 = vfmadd231ps_fma(auVar84,auVar91,auVar85);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar103,auVar89);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar103,auVar100);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar101,auVar103);
  auVar104._4_4_ = fVar135;
  auVar104._0_4_ = fVar135;
  auVar104._8_4_ = fVar135;
  auVar104._12_4_ = fVar135;
  auVar104._16_4_ = fVar135;
  auVar104._20_4_ = fVar135;
  auVar104._24_4_ = fVar135;
  auVar104._28_4_ = fVar135;
  auVar84 = ZEXT1632(CONCAT412(fVar172 * auVar38._12_4_,
                               CONCAT48(fVar172 * auVar38._8_4_,
                                        CONCAT44(fVar172 * auVar38._4_4_,fVar135))));
  auVar93 = vpermps_avx2(auVar149,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  auVar85 = vmulps_avx512vl(auVar84,auVar87);
  auVar96._0_4_ = auVar84._0_4_ * auVar88._0_4_;
  auVar96._4_4_ = auVar84._4_4_ * auVar88._4_4_;
  auVar96._8_4_ = auVar84._8_4_ * auVar88._8_4_;
  auVar96._12_4_ = auVar84._12_4_ * auVar88._12_4_;
  auVar96._16_4_ = auVar84._16_4_ * auVar88._16_4_;
  auVar96._20_4_ = auVar84._20_4_ * auVar88._20_4_;
  auVar96._24_4_ = auVar84._24_4_ * auVar88._24_4_;
  auVar96._28_4_ = 0;
  auVar88._4_4_ = auVar84._4_4_ * auVar92._4_4_;
  auVar88._0_4_ = auVar84._0_4_ * auVar92._0_4_;
  auVar88._8_4_ = auVar84._8_4_ * auVar92._8_4_;
  auVar88._12_4_ = auVar84._12_4_ * auVar92._12_4_;
  auVar88._16_4_ = auVar84._16_4_ * auVar92._16_4_;
  auVar88._20_4_ = auVar84._20_4_ * auVar92._20_4_;
  auVar88._24_4_ = auVar84._24_4_ * auVar92._24_4_;
  auVar88._28_4_ = auVar87._28_4_;
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar86);
  auVar44 = vfmadd231ps_fma(auVar96,auVar93,auVar90);
  auVar43 = vfmadd231ps_fma(auVar88,auVar93,auVar91);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar104,auVar89);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar104,auVar100);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar104,auVar101);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar89 = vandps_avx(ZEXT1632(auVar12),auVar98);
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar89,auVar102,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar85._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar12._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar12._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar12._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar12._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar37),auVar98);
  uVar29 = vcmpps_avx512vl(auVar89,auVar102,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar82._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar45),auVar98);
  uVar29 = vcmpps_avx512vl(auVar89,auVar102,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar89._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar85,auVar87,auVar99);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar82);
  auVar37 = vfnmadd213ps_fma(auVar82,auVar87,auVar99);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar89);
  auVar45 = vfnmadd213ps_fma(auVar89,auVar87,auVar99);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 7 + 6));
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar87,auVar87);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar87 = vsubps_avx512vl(auVar89,auVar86);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 9 + 6));
  auVar101._4_4_ = auVar12._4_4_ * auVar87._4_4_;
  auVar101._0_4_ = auVar12._0_4_ * auVar87._0_4_;
  auVar101._8_4_ = auVar12._8_4_ * auVar87._8_4_;
  auVar101._12_4_ = auVar12._12_4_ * auVar87._12_4_;
  auVar101._16_4_ = auVar87._16_4_ * 0.0;
  auVar101._20_4_ = auVar87._20_4_ * 0.0;
  auVar101._24_4_ = auVar87._24_4_ * 0.0;
  auVar101._28_4_ = auVar87._28_4_;
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86 = vsubps_avx512vl(auVar89,auVar86);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0xe + 6));
  auVar97._0_4_ = auVar12._0_4_ * auVar86._0_4_;
  auVar97._4_4_ = auVar12._4_4_ * auVar86._4_4_;
  auVar97._8_4_ = auVar12._8_4_ * auVar86._8_4_;
  auVar97._12_4_ = auVar12._12_4_ * auVar86._12_4_;
  auVar97._16_4_ = auVar86._16_4_ * 0.0;
  auVar97._20_4_ = auVar86._20_4_ * 0.0;
  auVar97._24_4_ = auVar86._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar44));
  auVar91._4_4_ = auVar37._4_4_ * auVar89._4_4_;
  auVar91._0_4_ = auVar37._0_4_ * auVar89._0_4_;
  auVar91._8_4_ = auVar37._8_4_ * auVar89._8_4_;
  auVar91._12_4_ = auVar37._12_4_ * auVar89._12_4_;
  auVar91._16_4_ = auVar89._16_4_ * 0.0;
  auVar91._20_4_ = auVar89._20_4_ * 0.0;
  auVar91._24_4_ = auVar89._24_4_ * 0.0;
  auVar91._28_4_ = auVar89._28_4_;
  auVar88 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar44));
  auVar95._0_4_ = auVar37._0_4_ * auVar89._0_4_;
  auVar95._4_4_ = auVar37._4_4_ * auVar89._4_4_;
  auVar95._8_4_ = auVar37._8_4_ * auVar89._8_4_;
  auVar95._12_4_ = auVar37._12_4_ * auVar89._12_4_;
  auVar95._16_4_ = auVar89._16_4_ * 0.0;
  auVar95._20_4_ = auVar89._20_4_ * 0.0;
  auVar95._24_4_ = auVar89._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x15 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar43));
  auVar92._4_4_ = auVar89._4_4_ * auVar45._4_4_;
  auVar92._0_4_ = auVar89._0_4_ * auVar45._0_4_;
  auVar92._8_4_ = auVar89._8_4_ * auVar45._8_4_;
  auVar92._12_4_ = auVar89._12_4_ * auVar45._12_4_;
  auVar92._16_4_ = auVar89._16_4_ * 0.0;
  auVar92._20_4_ = auVar89._20_4_ * 0.0;
  auVar92._24_4_ = auVar89._24_4_ * 0.0;
  auVar92._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x17 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar43));
  auVar83._0_4_ = auVar45._0_4_ * auVar89._0_4_;
  auVar83._4_4_ = auVar45._4_4_ * auVar89._4_4_;
  auVar83._8_4_ = auVar45._8_4_ * auVar89._8_4_;
  auVar83._12_4_ = auVar45._12_4_ * auVar89._12_4_;
  auVar83._16_4_ = auVar89._16_4_ * 0.0;
  auVar83._20_4_ = auVar89._20_4_ * 0.0;
  auVar83._24_4_ = auVar89._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar89 = vpminsd_avx2(auVar101,auVar97);
  auVar86 = vpminsd_avx2(auVar91,auVar95);
  auVar89 = vmaxps_avx(auVar89,auVar86);
  auVar86 = vpminsd_avx2(auVar92,auVar83);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar87._4_4_ = uVar125;
  auVar87._0_4_ = uVar125;
  auVar87._8_4_ = uVar125;
  auVar87._12_4_ = uVar125;
  auVar87._16_4_ = uVar125;
  auVar87._20_4_ = uVar125;
  auVar87._24_4_ = uVar125;
  auVar87._28_4_ = uVar125;
  auVar86 = vmaxps_avx512vl(auVar86,auVar87);
  auVar89 = vmaxps_avx(auVar89,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar89,auVar86);
  auVar89 = vpmaxsd_avx2(auVar101,auVar97);
  auVar86 = vpmaxsd_avx2(auVar91,auVar95);
  auVar89 = vminps_avx(auVar89,auVar86);
  auVar86 = vpmaxsd_avx2(auVar92,auVar83);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar125;
  auVar100._0_4_ = uVar125;
  auVar100._8_4_ = uVar125;
  auVar100._12_4_ = uVar125;
  auVar100._16_4_ = uVar125;
  auVar100._20_4_ = uVar125;
  auVar100._24_4_ = uVar125;
  auVar100._28_4_ = uVar125;
  auVar86 = vminps_avx512vl(auVar86,auVar100);
  auVar89 = vminps_avx(auVar89,auVar86);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar90);
  uVar13 = vcmpps_avx512vl(local_78,auVar89,2);
  uVar14 = vpcmpgtd_avx512vl(auVar88,_DAT_01fb4ba0);
  local_360 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_368 = pre->ray_space + k;
  auVar12 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar234 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar37);
  auVar243 = ZEXT464(0x3f800000);
  auVar37 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar242 = ZEXT1664(auVar37);
LAB_019c3fd2:
  pLVar23 = local_368;
  if (local_360 == 0) {
LAB_019c5b56:
    return local_360 != 0;
  }
  lVar26 = 0;
  for (uVar29 = local_360; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar26 = lVar26 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar26 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(_Var11 + uVar29 * (long)pvVar10);
  auVar45 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 1) * (long)pvVar10);
  auVar44 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 2) * (long)pvVar10);
  auVar43 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar29 + 3));
  lVar26 = *(long *)&pGVar8[1].time_range.upper;
  auVar56 = *(undefined1 (*) [16])(lVar26 + (long)p_Var9 * uVar29);
  auVar5 = *(undefined1 (*) [16])(lVar26 + (long)p_Var9 * (uVar29 + 1));
  auVar42 = *(undefined1 (*) [16])(lVar26 + (long)p_Var9 * (uVar29 + 2));
  uVar32 = local_360 - 1 & local_360;
  auVar41 = *(undefined1 (*) [16])(lVar26 + (long)p_Var9 * (uVar29 + 3));
  if (uVar32 != 0) {
    uVar30 = uVar32 - 1 & uVar32;
    for (uVar29 = uVar32; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    }
    if (uVar30 != 0) {
      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar126 = ZEXT816(0) << 0x40;
  auVar38._0_4_ = auVar41._0_4_ * 0.0;
  auVar38._4_4_ = auVar41._4_4_ * 0.0;
  auVar38._8_4_ = auVar41._8_4_ * 0.0;
  auVar38._12_4_ = auVar41._12_4_ * 0.0;
  auVar40 = vfmadd231ps_fma(auVar38,auVar42,auVar126);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar40);
  auVar57._0_4_ = auVar56._0_4_ + auVar38._0_4_;
  auVar57._4_4_ = auVar56._4_4_ + auVar38._4_4_;
  auVar57._8_4_ = auVar56._8_4_ + auVar38._8_4_;
  auVar57._12_4_ = auVar56._12_4_ + auVar38._12_4_;
  auVar127 = auVar234._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar40,auVar5,auVar127);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar56,auVar127);
  auVar72._0_4_ = auVar43._0_4_ * 0.0;
  auVar72._4_4_ = auVar43._4_4_ * 0.0;
  auVar72._8_4_ = auVar43._8_4_ * 0.0;
  auVar72._12_4_ = auVar43._12_4_ * 0.0;
  auVar40 = vfmadd231ps_fma(auVar72,auVar44,auVar126);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar45,auVar40);
  auVar73._0_4_ = auVar37._0_4_ + auVar38._0_4_;
  auVar73._4_4_ = auVar37._4_4_ + auVar38._4_4_;
  auVar73._8_4_ = auVar37._8_4_ + auVar38._8_4_;
  auVar73._12_4_ = auVar37._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar127);
  auVar40 = vfnmadd231ps_avx512vl(auVar38,auVar37,auVar127);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar41);
  auVar38 = vfmadd231ps_fma(auVar38,auVar5,auVar126);
  auVar38 = vfmadd231ps_fma(auVar38,auVar56,auVar126);
  auVar41 = vmulps_avx512vl(auVar41,auVar127);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar127,auVar42);
  auVar5 = vfmadd231ps_fma(auVar42,auVar126,auVar5);
  auVar41 = vfnmadd231ps_fma(auVar5,auVar126,auVar56);
  auVar56 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar43);
  auVar56 = vfmadd231ps_fma(auVar56,auVar45,auVar126);
  auVar56 = vfmadd231ps_fma(auVar56,auVar37,auVar126);
  auVar43 = vmulps_avx512vl(auVar43,auVar127);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar127,auVar44);
  auVar45 = vfmadd231ps_fma(auVar44,auVar126,auVar45);
  auVar5 = vfnmadd231ps_fma(auVar45,auVar126,auVar37);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar45 = vshufps_avx(auVar73,auVar73,0xc9);
  fVar209 = auVar39._0_4_;
  auVar48._0_4_ = fVar209 * auVar45._0_4_;
  fVar122 = auVar39._4_4_;
  auVar48._4_4_ = fVar122 * auVar45._4_4_;
  fVar123 = auVar39._8_4_;
  auVar48._8_4_ = fVar123 * auVar45._8_4_;
  fVar124 = auVar39._12_4_;
  auVar48._12_4_ = fVar124 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar48,auVar37,auVar73);
  auVar44 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar49._0_4_ = fVar209 * auVar45._0_4_;
  auVar49._4_4_ = fVar122 * auVar45._4_4_;
  auVar49._8_4_ = fVar123 * auVar45._8_4_;
  auVar49._12_4_ = fVar124 * auVar45._12_4_;
  auVar37 = vfmsub231ps_fma(auVar49,auVar37,auVar40);
  auVar43 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar45 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar135 = auVar41._0_4_;
  auVar46._0_4_ = fVar135 * auVar45._0_4_;
  fVar151 = auVar41._4_4_;
  auVar46._4_4_ = fVar151 * auVar45._4_4_;
  fVar152 = auVar41._8_4_;
  auVar46._8_4_ = fVar152 * auVar45._8_4_;
  fVar153 = auVar41._12_4_;
  auVar46._12_4_ = fVar153 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar46,auVar37,auVar56);
  auVar56 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar67._0_4_ = auVar45._0_4_ * fVar135;
  auVar67._4_4_ = auVar45._4_4_ * fVar151;
  auVar67._8_4_ = auVar45._8_4_ * fVar152;
  auVar67._12_4_ = auVar45._12_4_ * fVar153;
  auVar37 = vfmsub231ps_fma(auVar67,auVar37,auVar5);
  auVar5 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar172 = auVar37._0_4_;
  auVar65._4_12_ = ZEXT812(0) << 0x20;
  auVar65._0_4_ = fVar172;
  auVar45 = vrsqrt14ss_avx512f(auVar126,auVar65);
  auVar42 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar40 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar117 = auVar45._0_4_;
  fVar197 = auVar42._0_4_ - auVar40._0_4_ * fVar117 * fVar117 * fVar117;
  fVar211 = fVar197 * auVar44._0_4_;
  fVar219 = fVar197 * auVar44._4_4_;
  fVar220 = fVar197 * auVar44._8_4_;
  fVar221 = fVar197 * auVar44._12_4_;
  auVar45 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar78._0_4_ = auVar43._0_4_ * fVar172;
  auVar78._4_4_ = auVar43._4_4_ * fVar172;
  auVar78._8_4_ = auVar43._8_4_ * fVar172;
  auVar78._12_4_ = auVar43._12_4_ * fVar172;
  fVar172 = auVar45._0_4_;
  auVar53._0_4_ = fVar172 * auVar44._0_4_;
  auVar53._4_4_ = fVar172 * auVar44._4_4_;
  auVar53._8_4_ = fVar172 * auVar44._8_4_;
  auVar53._12_4_ = fVar172 * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar78,auVar53);
  auVar45 = vrcp14ss_avx512f(auVar126,auVar65);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar45,ZEXT416(0x40000000));
  fVar172 = auVar45._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar117 = auVar37._0_4_;
  auVar68._4_12_ = ZEXT812(0) << 0x20;
  auVar68._0_4_ = fVar117;
  auVar45 = vrsqrt14ss_avx512f(auVar126,auVar68);
  auVar43 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar207 = auVar45._0_4_;
  fVar207 = auVar43._0_4_ - auVar42._0_4_ * fVar207 * fVar207 * fVar207;
  fVar196 = fVar207 * auVar56._0_4_;
  fVar206 = fVar207 * auVar56._4_4_;
  fVar208 = fVar207 * auVar56._8_4_;
  fVar210 = fVar207 * auVar56._12_4_;
  auVar45 = vdpps_avx(auVar56,auVar5,0x7f);
  auVar50._0_4_ = fVar117 * auVar5._0_4_;
  auVar50._4_4_ = fVar117 * auVar5._4_4_;
  auVar50._8_4_ = fVar117 * auVar5._8_4_;
  auVar50._12_4_ = fVar117 * auVar5._12_4_;
  fVar117 = auVar45._0_4_;
  auVar47._0_4_ = fVar117 * auVar56._0_4_;
  auVar47._4_4_ = fVar117 * auVar56._4_4_;
  auVar47._8_4_ = fVar117 * auVar56._8_4_;
  auVar47._12_4_ = fVar117 * auVar56._12_4_;
  auVar43 = vsubps_avx(auVar50,auVar47);
  auVar45 = vrcp14ss_avx512f(auVar126,auVar68);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar45,ZEXT416(0x40000000));
  fVar117 = auVar37._0_4_ * auVar45._0_4_;
  auVar37 = vshufps_avx(auVar57,auVar57,0xff);
  auVar173._0_4_ = fVar211 * auVar37._0_4_;
  auVar173._4_4_ = fVar219 * auVar37._4_4_;
  auVar173._8_4_ = fVar220 * auVar37._8_4_;
  auVar173._12_4_ = fVar221 * auVar37._12_4_;
  auVar5 = vsubps_avx(auVar57,auVar173);
  auVar45 = vshufps_avx(auVar39,auVar39,0xff);
  auVar51._0_4_ = auVar45._0_4_ * fVar211 + auVar37._0_4_ * fVar197 * fVar172 * auVar44._0_4_;
  auVar51._4_4_ = auVar45._4_4_ * fVar219 + auVar37._4_4_ * fVar197 * fVar172 * auVar44._4_4_;
  auVar51._8_4_ = auVar45._8_4_ * fVar220 + auVar37._8_4_ * fVar197 * fVar172 * auVar44._8_4_;
  auVar51._12_4_ = auVar45._12_4_ * fVar221 + auVar37._12_4_ * fVar197 * fVar172 * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar39,auVar51);
  auVar225._0_4_ = auVar173._0_4_ + auVar57._0_4_;
  auVar225._4_4_ = auVar173._4_4_ + auVar57._4_4_;
  auVar225._8_4_ = auVar173._8_4_ + auVar57._8_4_;
  auVar225._12_4_ = auVar173._12_4_ + auVar57._12_4_;
  auVar37 = vshufps_avx(auVar38,auVar38,0xff);
  auVar52._0_4_ = fVar196 * auVar37._0_4_;
  auVar52._4_4_ = fVar206 * auVar37._4_4_;
  auVar52._8_4_ = fVar208 * auVar37._8_4_;
  auVar52._12_4_ = fVar210 * auVar37._12_4_;
  auVar42 = vsubps_avx(auVar38,auVar52);
  auVar45 = vshufps_avx(auVar41,auVar41,0xff);
  auVar58._0_4_ = auVar45._0_4_ * fVar196 + auVar37._0_4_ * fVar207 * auVar43._0_4_ * fVar117;
  auVar58._4_4_ = auVar45._4_4_ * fVar206 + auVar37._4_4_ * fVar207 * auVar43._4_4_ * fVar117;
  auVar58._8_4_ = auVar45._8_4_ * fVar208 + auVar37._8_4_ * fVar207 * auVar43._8_4_ * fVar117;
  auVar58._12_4_ = auVar45._12_4_ * fVar210 + auVar37._12_4_ * fVar207 * auVar43._12_4_ * fVar117;
  auVar37 = vsubps_avx(auVar41,auVar58);
  auVar46 = vaddps_avx512vl(auVar38,auVar52);
  auVar136._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar136._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar136._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar136._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar47 = vaddps_avx512vl(auVar5,auVar136);
  auVar137._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar137._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar137._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar137._12_4_ = auVar37._12_4_ * 0.33333334;
  auVar48 = vsubps_avx512vl(auVar42,auVar137);
  auVar40._0_4_ = (fVar209 + auVar51._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar122 + auVar51._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar123 + auVar51._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar124 + auVar51._12_4_) * 0.33333334;
  auVar49 = vaddps_avx512vl(auVar225,auVar40);
  auVar126._0_4_ = (fVar135 + auVar58._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar151 + auVar58._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar152 + auVar58._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar153 + auVar58._12_4_) * 0.33333334;
  auVar50 = vsubps_avx512vl(auVar46,auVar126);
  auVar41 = vsubps_avx(auVar5,auVar76);
  uVar125 = auVar41._0_4_;
  auVar59._4_4_ = uVar125;
  auVar59._0_4_ = uVar125;
  auVar59._8_4_ = uVar125;
  auVar59._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar41,auVar41,0x55);
  auVar45 = vshufps_avx(auVar41,auVar41,0xaa);
  aVar3 = (local_368->vx).field_0;
  aVar4 = (local_368->vy).field_0;
  fVar172 = (local_368->vz).field_0.m128[0];
  fVar117 = *(float *)((long)&(local_368->vz).field_0 + 4);
  fVar197 = *(float *)((long)&(local_368->vz).field_0 + 8);
  fVar207 = *(float *)((long)&(local_368->vz).field_0 + 0xc);
  auVar127._0_4_ = fVar172 * auVar45._0_4_;
  auVar127._4_4_ = fVar117 * auVar45._4_4_;
  auVar127._8_4_ = fVar197 * auVar45._8_4_;
  auVar127._12_4_ = fVar207 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar4,auVar37);
  auVar57 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar59);
  auVar51 = vsubps_avx512vl(auVar47,auVar76);
  uVar125 = auVar51._0_4_;
  auVar138._4_4_ = uVar125;
  auVar138._0_4_ = uVar125;
  auVar138._8_4_ = uVar125;
  auVar138._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar51,auVar51,0x55);
  auVar45 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar60._0_4_ = fVar172 * auVar45._0_4_;
  auVar60._4_4_ = fVar117 * auVar45._4_4_;
  auVar60._8_4_ = fVar197 * auVar45._8_4_;
  auVar60._12_4_ = fVar207 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar4,auVar37);
  auVar58 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar138);
  auVar52 = vsubps_avx512vl(auVar48,auVar76);
  uVar125 = auVar52._0_4_;
  auVar54._4_4_ = uVar125;
  auVar54._0_4_ = uVar125;
  auVar54._8_4_ = uVar125;
  auVar54._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar52,auVar52,0x55);
  auVar45 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar139._0_4_ = fVar172 * auVar45._0_4_;
  auVar139._4_4_ = fVar117 * auVar45._4_4_;
  auVar139._8_4_ = fVar197 * auVar45._8_4_;
  auVar139._12_4_ = fVar207 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar4,auVar37);
  auVar59 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar54);
  auVar38 = vsubps_avx(auVar42,auVar76);
  uVar125 = auVar38._0_4_;
  auVar55._4_4_ = uVar125;
  auVar55._0_4_ = uVar125;
  auVar55._8_4_ = uVar125;
  auVar55._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar38,auVar38,0x55);
  auVar45 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar66._0_4_ = auVar45._0_4_ * fVar172;
  auVar66._4_4_ = auVar45._4_4_ * fVar117;
  auVar66._8_4_ = auVar45._8_4_ * fVar197;
  auVar66._12_4_ = auVar45._12_4_ * fVar207;
  auVar37 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar37);
  auVar60 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar55);
  auVar40 = vsubps_avx(auVar225,auVar76);
  uVar125 = auVar40._0_4_;
  auVar62._4_4_ = uVar125;
  auVar62._0_4_ = uVar125;
  auVar62._8_4_ = uVar125;
  auVar62._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar40,auVar40,0x55);
  auVar45 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar81._0_4_ = auVar45._0_4_ * fVar172;
  auVar81._4_4_ = auVar45._4_4_ * fVar117;
  auVar81._8_4_ = auVar45._8_4_ * fVar197;
  auVar81._12_4_ = auVar45._12_4_ * fVar207;
  auVar37 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar37);
  auVar136 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar62);
  auVar53 = vsubps_avx512vl(auVar49,auVar76);
  uVar125 = auVar53._0_4_;
  auVar63._4_4_ = uVar125;
  auVar63._0_4_ = uVar125;
  auVar63._8_4_ = uVar125;
  auVar63._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar53,auVar53,0x55);
  auVar45 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar71._0_4_ = auVar45._0_4_ * fVar172;
  auVar71._4_4_ = auVar45._4_4_ * fVar117;
  auVar71._8_4_ = auVar45._8_4_ * fVar197;
  auVar71._12_4_ = auVar45._12_4_ * fVar207;
  auVar37 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar4,auVar37);
  auVar137 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar63);
  auVar54 = vsubps_avx512vl(auVar50,auVar76);
  uVar125 = auVar54._0_4_;
  auVar64._4_4_ = uVar125;
  auVar64._0_4_ = uVar125;
  auVar64._8_4_ = uVar125;
  auVar64._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar54,auVar54,0x55);
  auVar45 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar75._0_4_ = auVar45._0_4_ * fVar172;
  auVar75._4_4_ = auVar45._4_4_ * fVar117;
  auVar75._8_4_ = auVar45._8_4_ * fVar197;
  auVar75._12_4_ = auVar45._12_4_ * fVar207;
  auVar37 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar37);
  auVar138 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar64);
  auVar55 = vsubps_avx512vl(auVar46,auVar76);
  uVar125 = auVar55._0_4_;
  auVar39._4_4_ = uVar125;
  auVar39._0_4_ = uVar125;
  auVar39._8_4_ = uVar125;
  auVar39._12_4_ = uVar125;
  auVar37 = vshufps_avx(auVar55,auVar55,0x55);
  auVar45 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar61._0_4_ = auVar45._0_4_ * fVar172;
  auVar61._4_4_ = auVar45._4_4_ * fVar117;
  auVar61._8_4_ = auVar45._8_4_ * fVar197;
  auVar61._12_4_ = auVar45._12_4_ * fVar207;
  auVar37 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar37);
  auVar139 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar39);
  auVar44 = vmovlhps_avx(auVar57,auVar136);
  auVar39 = vmovlhps_avx512f(auVar58,auVar137);
  auVar126 = vmovlhps_avx512f(auVar59,auVar138);
  auVar127 = vmovlhps_avx512f(auVar60,auVar139);
  auVar37 = vminps_avx512vl(auVar44,auVar39);
  auVar43 = vmaxps_avx512vl(auVar44,auVar39);
  auVar45 = vminps_avx512vl(auVar126,auVar127);
  auVar45 = vminps_avx(auVar37,auVar45);
  auVar37 = vmaxps_avx512vl(auVar126,auVar127);
  auVar37 = vmaxps_avx(auVar43,auVar37);
  auVar43 = vshufpd_avx(auVar45,auVar45,3);
  auVar56 = vshufpd_avx(auVar37,auVar37,3);
  auVar45 = vminps_avx(auVar45,auVar43);
  auVar37 = vmaxps_avx(auVar37,auVar56);
  auVar45 = vandps_avx512vl(auVar45,auVar235._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar235._0_16_);
  auVar37 = vmaxps_avx(auVar45,auVar37);
  auVar45 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar45,auVar37);
  fVar172 = auVar37._0_4_ * 9.536743e-07;
  auVar166._8_8_ = auVar57._0_8_;
  auVar166._0_8_ = auVar57._0_8_;
  auVar43 = vmovddup_avx512vl(auVar58);
  auVar56 = vmovddup_avx512vl(auVar59);
  auVar181._0_8_ = auVar60._0_8_;
  auVar181._8_8_ = auVar181._0_8_;
  auVar89 = vbroadcastss_avx512vl(ZEXT416((uint)fVar172));
  auVar37 = vxorps_avx512vl(auVar89._0_16_,auVar236._0_16_);
  auVar86 = vbroadcastss_avx512vl(auVar37);
  auVar57 = vpbroadcastd_avx512vl();
  bVar31 = false;
  uVar29 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x30);
  auVar58 = vsubps_avx512vl(auVar39,auVar44);
  auVar59 = vsubps_avx512vl(auVar126,auVar39);
  auVar60 = vsubps_avx512vl(auVar127,auVar126);
  auVar37 = vsubps_avx(auVar225,auVar5);
  auVar61 = vsubps_avx512vl(auVar49,auVar47);
  auVar62 = vsubps_avx512vl(auVar50,auVar48);
  auVar63 = vsubps_avx512vl(auVar46,auVar42);
  auVar64 = vpbroadcastd_avx512vl();
  auVar45 = ZEXT816(0x3f80000000000000);
  auVar76 = auVar45;
LAB_019c4725:
  auVar68 = vshufps_avx(auVar76,auVar76,0x50);
  auVar77._8_4_ = 0x3f800000;
  auVar77._0_8_ = 0x3f8000003f800000;
  auVar77._12_4_ = 0x3f800000;
  auVar228._16_4_ = 0x3f800000;
  auVar228._0_16_ = auVar77;
  auVar228._20_4_ = 0x3f800000;
  auVar228._24_4_ = 0x3f800000;
  auVar228._28_4_ = 0x3f800000;
  auVar173 = vsubps_avx(auVar77,auVar68);
  fVar117 = auVar68._0_4_;
  fVar122 = auVar136._0_4_;
  auVar146._0_4_ = fVar122 * fVar117;
  fVar197 = auVar68._4_4_;
  fVar123 = auVar136._4_4_;
  auVar146._4_4_ = fVar123 * fVar197;
  fVar207 = auVar68._8_4_;
  auVar146._8_4_ = fVar122 * fVar207;
  fVar209 = auVar68._12_4_;
  auVar146._12_4_ = fVar123 * fVar209;
  fVar124 = auVar137._0_4_;
  auVar69._0_4_ = fVar124 * fVar117;
  fVar135 = auVar137._4_4_;
  auVar69._4_4_ = fVar135 * fVar197;
  auVar69._8_4_ = fVar124 * fVar207;
  auVar69._12_4_ = fVar135 * fVar209;
  fVar151 = auVar138._0_4_;
  auVar70._0_4_ = fVar151 * fVar117;
  fVar152 = auVar138._4_4_;
  auVar70._4_4_ = fVar152 * fVar197;
  auVar70._8_4_ = fVar151 * fVar207;
  auVar70._12_4_ = fVar152 * fVar209;
  fVar153 = auVar139._0_4_;
  auVar74._0_4_ = fVar153 * fVar117;
  fVar196 = auVar139._4_4_;
  auVar74._4_4_ = fVar196 * fVar197;
  auVar74._8_4_ = fVar153 * fVar207;
  auVar74._12_4_ = fVar196 * fVar209;
  auVar67 = vfmadd231ps_fma(auVar146,auVar173,auVar166);
  auVar65 = vfmadd231ps_avx512vl(auVar69,auVar173,auVar43);
  auVar66 = vfmadd231ps_avx512vl(auVar70,auVar173,auVar56);
  auVar173 = vfmadd231ps_fma(auVar74,auVar181,auVar173);
  auVar68 = vmovshdup_avx(auVar45);
  fVar197 = auVar45._0_4_;
  fVar117 = (auVar68._0_4_ - fVar197) * 0.04761905;
  auVar180._4_4_ = fVar197;
  auVar180._0_4_ = fVar197;
  auVar180._8_4_ = fVar197;
  auVar180._12_4_ = fVar197;
  auVar180._16_4_ = fVar197;
  auVar180._20_4_ = fVar197;
  auVar180._24_4_ = fVar197;
  auVar180._28_4_ = fVar197;
  auVar144._0_8_ = auVar68._0_8_;
  auVar144._8_8_ = auVar144._0_8_;
  auVar144._16_8_ = auVar144._0_8_;
  auVar144._24_8_ = auVar144._0_8_;
  auVar87 = vsubps_avx(auVar144,auVar180);
  uVar125 = auVar67._0_4_;
  auVar145._4_4_ = uVar125;
  auVar145._0_4_ = uVar125;
  auVar145._8_4_ = uVar125;
  auVar145._12_4_ = uVar125;
  auVar145._16_4_ = uVar125;
  auVar145._20_4_ = uVar125;
  auVar145._24_4_ = uVar125;
  auVar145._28_4_ = uVar125;
  auVar193._8_4_ = 1;
  auVar193._0_8_ = 0x100000001;
  auVar193._12_4_ = 1;
  auVar193._16_4_ = 1;
  auVar193._20_4_ = 1;
  auVar193._24_4_ = 1;
  auVar193._28_4_ = 1;
  auVar88 = ZEXT1632(auVar67);
  auVar100 = vpermps_avx2(auVar193,auVar88);
  auVar90 = vbroadcastss_avx512vl(auVar65);
  auVar101 = ZEXT1632(auVar65);
  auVar91 = vpermps_avx512vl(auVar193,auVar101);
  auVar92 = vbroadcastss_avx512vl(auVar66);
  auVar96 = ZEXT1632(auVar66);
  auVar93 = vpermps_avx512vl(auVar193,auVar96);
  auVar84 = vbroadcastss_avx512vl(auVar173);
  auVar97 = ZEXT1632(auVar173);
  auVar85 = vpermps_avx512vl(auVar193,auVar97);
  auVar194._4_4_ = fVar117;
  auVar194._0_4_ = fVar117;
  auVar194._8_4_ = fVar117;
  auVar194._12_4_ = fVar117;
  auVar194._16_4_ = fVar117;
  auVar194._20_4_ = fVar117;
  auVar194._24_4_ = fVar117;
  auVar194._28_4_ = fVar117;
  auVar98 = auVar241._0_32_;
  auVar94 = vpermps_avx512vl(auVar98,auVar88);
  auVar171._8_4_ = 3;
  auVar171._0_8_ = 0x300000003;
  auVar171._12_4_ = 3;
  auVar171._16_4_ = 3;
  auVar171._20_4_ = 3;
  auVar171._24_4_ = 3;
  auVar171._28_4_ = 3;
  auVar82 = vpermps_avx512vl(auVar171,auVar88);
  auVar83 = vpermps_avx512vl(auVar98,auVar101);
  auVar88 = vpermps_avx2(auVar171,auVar101);
  auVar95 = vpermps_avx512vl(auVar98,auVar96);
  auVar101 = vpermps_avx2(auVar171,auVar96);
  auVar96 = vpermps_avx512vl(auVar98,auVar97);
  auVar97 = vpermps_avx512vl(auVar171,auVar97);
  auVar68 = vfmadd132ps_fma(auVar87,auVar180,_DAT_01f7b040);
  auVar87 = vsubps_avx(auVar228,ZEXT1632(auVar68));
  auVar98 = vmulps_avx512vl(auVar90,ZEXT1632(auVar68));
  auVar102 = ZEXT1632(auVar68);
  auVar99 = vmulps_avx512vl(auVar91,auVar102);
  auVar173 = vfmadd231ps_fma(auVar98,auVar87,auVar145);
  auVar67 = vfmadd231ps_fma(auVar99,auVar87,auVar100);
  auVar98 = vmulps_avx512vl(auVar92,auVar102);
  auVar99 = vmulps_avx512vl(auVar93,auVar102);
  auVar90 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar90);
  auVar91 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar91);
  auVar98 = vmulps_avx512vl(auVar84,auVar102);
  auVar99 = ZEXT1632(auVar68);
  auVar85 = vmulps_avx512vl(auVar85,auVar99);
  auVar92 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar92);
  auVar93 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar93);
  fVar207 = auVar68._0_4_;
  fVar209 = auVar68._4_4_;
  auVar158._4_4_ = fVar209 * auVar90._4_4_;
  auVar158._0_4_ = fVar207 * auVar90._0_4_;
  fVar206 = auVar68._8_4_;
  auVar158._8_4_ = fVar206 * auVar90._8_4_;
  fVar208 = auVar68._12_4_;
  auVar158._12_4_ = fVar208 * auVar90._12_4_;
  auVar158._16_4_ = auVar90._16_4_ * 0.0;
  auVar158._20_4_ = auVar90._20_4_ * 0.0;
  auVar158._24_4_ = auVar90._24_4_ * 0.0;
  auVar158._28_4_ = fVar197;
  auVar17._4_4_ = fVar209 * auVar91._4_4_;
  auVar17._0_4_ = fVar207 * auVar91._0_4_;
  auVar17._8_4_ = fVar206 * auVar91._8_4_;
  auVar17._12_4_ = fVar208 * auVar91._12_4_;
  auVar17._16_4_ = auVar91._16_4_ * 0.0;
  auVar17._20_4_ = auVar91._20_4_ * 0.0;
  auVar17._24_4_ = auVar91._24_4_ * 0.0;
  auVar17._28_4_ = auVar100._28_4_;
  auVar173 = vfmadd231ps_fma(auVar158,auVar87,ZEXT1632(auVar173));
  auVar67 = vfmadd231ps_fma(auVar17,auVar87,ZEXT1632(auVar67));
  auVar133._0_4_ = fVar207 * auVar92._0_4_;
  auVar133._4_4_ = fVar209 * auVar92._4_4_;
  auVar133._8_4_ = fVar206 * auVar92._8_4_;
  auVar133._12_4_ = fVar208 * auVar92._12_4_;
  auVar133._16_4_ = auVar92._16_4_ * 0.0;
  auVar133._20_4_ = auVar92._20_4_ * 0.0;
  auVar133._24_4_ = auVar92._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar18._4_4_ = fVar209 * auVar93._4_4_;
  auVar18._0_4_ = fVar207 * auVar93._0_4_;
  auVar18._8_4_ = fVar206 * auVar93._8_4_;
  auVar18._12_4_ = fVar208 * auVar93._12_4_;
  auVar18._16_4_ = auVar93._16_4_ * 0.0;
  auVar18._20_4_ = auVar93._20_4_ * 0.0;
  auVar18._24_4_ = auVar93._24_4_ * 0.0;
  auVar18._28_4_ = auVar92._28_4_;
  auVar65 = vfmadd231ps_fma(auVar133,auVar87,auVar90);
  auVar66 = vfmadd231ps_fma(auVar18,auVar87,auVar91);
  auVar19._28_4_ = auVar91._28_4_;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(fVar208 * auVar66._12_4_,
                          CONCAT48(fVar206 * auVar66._8_4_,
                                   CONCAT44(fVar209 * auVar66._4_4_,fVar207 * auVar66._0_4_))));
  auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar208 * auVar65._12_4_,
                                               CONCAT48(fVar206 * auVar65._8_4_,
                                                        CONCAT44(fVar209 * auVar65._4_4_,
                                                                 fVar207 * auVar65._0_4_)))),auVar87
                            ,ZEXT1632(auVar173));
  auVar81 = vfmadd231ps_fma(auVar19,auVar87,ZEXT1632(auVar67));
  auVar100 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar173));
  auVar90 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar67));
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar100 = vmulps_avx512vl(auVar100,auVar91);
  auVar90 = vmulps_avx512vl(auVar90,auVar91);
  auVar190._0_4_ = fVar117 * auVar100._0_4_;
  auVar190._4_4_ = fVar117 * auVar100._4_4_;
  auVar190._8_4_ = fVar117 * auVar100._8_4_;
  auVar190._12_4_ = fVar117 * auVar100._12_4_;
  auVar190._16_4_ = fVar117 * auVar100._16_4_;
  auVar190._20_4_ = fVar117 * auVar100._20_4_;
  auVar190._24_4_ = fVar117 * auVar100._24_4_;
  auVar190._28_4_ = 0;
  auVar100 = vmulps_avx512vl(auVar194,auVar90);
  auVar67 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
  auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01fb9fc0,ZEXT1632(auVar67));
  auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar81),_DAT_01fb9fc0,ZEXT1632(auVar67));
  auVar134._0_4_ = auVar190._0_4_ + auVar78._0_4_;
  auVar134._4_4_ = auVar190._4_4_ + auVar78._4_4_;
  auVar134._8_4_ = auVar190._8_4_ + auVar78._8_4_;
  auVar134._12_4_ = auVar190._12_4_ + auVar78._12_4_;
  auVar134._16_4_ = auVar190._16_4_ + 0.0;
  auVar134._20_4_ = auVar190._20_4_ + 0.0;
  auVar134._24_4_ = auVar190._24_4_ + 0.0;
  auVar134._28_4_ = 0;
  auVar102 = ZEXT1632(auVar67);
  auVar93 = vpermt2ps_avx512vl(auVar190,_DAT_01fb9fc0,auVar102);
  auVar84 = vaddps_avx512vl(ZEXT1632(auVar81),auVar100);
  auVar85 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar102);
  auVar100 = vsubps_avx(auVar90,auVar93);
  auVar93 = vsubps_avx512vl(auVar92,auVar85);
  auVar85 = vmulps_avx512vl(auVar83,auVar99);
  auVar98 = vmulps_avx512vl(auVar88,auVar99);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar94);
  auVar94 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar82);
  auVar82 = vmulps_avx512vl(auVar95,auVar99);
  auVar98 = vmulps_avx512vl(auVar101,auVar99);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar83);
  auVar88 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar88);
  auVar83 = vmulps_avx512vl(auVar96,auVar99);
  auVar96 = vmulps_avx512vl(auVar97,auVar99);
  auVar173 = vfmadd231ps_fma(auVar83,auVar87,auVar95);
  auVar83 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar101);
  auVar95 = vmulps_avx512vl(auVar99,auVar82);
  auVar97 = ZEXT1632(auVar68);
  auVar96 = vmulps_avx512vl(auVar97,auVar88);
  auVar85 = vfmadd231ps_avx512vl(auVar95,auVar87,auVar85);
  auVar94 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar94);
  auVar83 = vmulps_avx512vl(auVar97,auVar83);
  auVar82 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar208 * auVar173._12_4_,
                                          CONCAT48(fVar206 * auVar173._8_4_,
                                                   CONCAT44(fVar209 * auVar173._4_4_,
                                                            fVar207 * auVar173._0_4_)))),auVar87,
                       auVar82);
  auVar88 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar88);
  auVar20._4_4_ = fVar209 * auVar82._4_4_;
  auVar20._0_4_ = fVar207 * auVar82._0_4_;
  auVar20._8_4_ = fVar206 * auVar82._8_4_;
  auVar20._12_4_ = fVar208 * auVar82._12_4_;
  auVar20._16_4_ = auVar82._16_4_ * 0.0;
  auVar20._20_4_ = auVar82._20_4_ * 0.0;
  auVar20._24_4_ = auVar82._24_4_ * 0.0;
  auVar20._28_4_ = auVar101._28_4_;
  auVar101 = vmulps_avx512vl(auVar97,auVar88);
  auVar83 = vfmadd231ps_avx512vl(auVar20,auVar87,auVar85);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar87);
  auVar87 = vsubps_avx512vl(auVar82,auVar85);
  auVar88 = vsubps_avx512vl(auVar88,auVar94);
  auVar87 = vmulps_avx512vl(auVar87,auVar91);
  auVar88 = vmulps_avx512vl(auVar88,auVar91);
  fVar197 = fVar117 * auVar87._0_4_;
  fVar207 = fVar117 * auVar87._4_4_;
  auVar21._4_4_ = fVar207;
  auVar21._0_4_ = fVar197;
  fVar209 = fVar117 * auVar87._8_4_;
  auVar21._8_4_ = fVar209;
  fVar206 = fVar117 * auVar87._12_4_;
  auVar21._12_4_ = fVar206;
  fVar208 = fVar117 * auVar87._16_4_;
  auVar21._16_4_ = fVar208;
  fVar210 = fVar117 * auVar87._20_4_;
  auVar21._20_4_ = fVar210;
  fVar117 = fVar117 * auVar87._24_4_;
  auVar21._24_4_ = fVar117;
  auVar21._28_4_ = auVar87._28_4_;
  auVar88 = vmulps_avx512vl(auVar194,auVar88);
  auVar91 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar102);
  auVar85 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar102);
  auVar195._0_4_ = auVar83._0_4_ + fVar197;
  auVar195._4_4_ = auVar83._4_4_ + fVar207;
  auVar195._8_4_ = auVar83._8_4_ + fVar209;
  auVar195._12_4_ = auVar83._12_4_ + fVar206;
  auVar195._16_4_ = auVar83._16_4_ + fVar208;
  auVar195._20_4_ = auVar83._20_4_ + fVar210;
  auVar195._24_4_ = auVar83._24_4_ + fVar117;
  auVar195._28_4_ = auVar83._28_4_ + auVar87._28_4_;
  auVar87 = vpermt2ps_avx512vl(auVar21,_DAT_01fb9fc0,ZEXT1632(auVar67));
  auVar94 = vaddps_avx512vl(auVar101,auVar88);
  auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar67));
  auVar87 = vsubps_avx(auVar91,auVar87);
  auVar88 = vsubps_avx512vl(auVar85,auVar88);
  auVar149 = ZEXT1632(auVar78);
  auVar82 = vsubps_avx512vl(auVar83,auVar149);
  auVar158 = ZEXT1632(auVar81);
  auVar95 = vsubps_avx512vl(auVar101,auVar158);
  auVar96 = vsubps_avx512vl(auVar91,auVar90);
  auVar82 = vaddps_avx512vl(auVar82,auVar96);
  auVar96 = vsubps_avx512vl(auVar85,auVar92);
  auVar95 = vaddps_avx512vl(auVar95,auVar96);
  auVar96 = vmulps_avx512vl(auVar158,auVar82);
  auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar149,auVar95);
  auVar97 = vmulps_avx512vl(auVar84,auVar82);
  auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar134,auVar95);
  auVar98 = vmulps_avx512vl(auVar93,auVar82);
  auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar100,auVar95);
  auVar99 = vmulps_avx512vl(auVar92,auVar82);
  auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar90,auVar95);
  auVar102 = vmulps_avx512vl(auVar101,auVar82);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar83,auVar95);
  auVar103 = vmulps_avx512vl(auVar94,auVar82);
  auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar195,auVar95);
  auVar104 = vmulps_avx512vl(auVar88,auVar82);
  auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar87,auVar95);
  auVar82 = vmulps_avx512vl(auVar85,auVar82);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar91,auVar95);
  auVar95 = vminps_avx512vl(auVar96,auVar97);
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar97 = vminps_avx512vl(auVar98,auVar99);
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar97 = vmaxps_avx512vl(auVar98,auVar99);
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar97 = vminps_avx512vl(auVar102,auVar103);
  auVar98 = vmaxps_avx512vl(auVar102,auVar103);
  auVar99 = vminps_avx512vl(auVar104,auVar82);
  auVar97 = vminps_avx512vl(auVar97,auVar99);
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar82 = vmaxps_avx512vl(auVar104,auVar82);
  auVar82 = vmaxps_avx512vl(auVar98,auVar82);
  auVar82 = vmaxps_avx512vl(auVar96,auVar82);
  uVar13 = vcmpps_avx512vl(auVar95,auVar89,2);
  uVar14 = vcmpps_avx512vl(auVar82,auVar86,5);
  bVar24 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar24 != 0) {
    auVar82 = vsubps_avx512vl(auVar90,auVar149);
    auVar95 = vsubps_avx512vl(auVar92,auVar158);
    auVar96 = vsubps_avx512vl(auVar91,auVar83);
    auVar82 = vaddps_avx512vl(auVar82,auVar96);
    auVar96 = vsubps_avx512vl(auVar85,auVar101);
    auVar95 = vaddps_avx512vl(auVar95,auVar96);
    auVar96 = vmulps_avx512vl(auVar158,auVar82);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar95,auVar149);
    auVar84 = vmulps_avx512vl(auVar84,auVar82);
    auVar84 = vfnmadd213ps_avx512vl(auVar134,auVar95,auVar84);
    auVar93 = vmulps_avx512vl(auVar93,auVar82);
    auVar93 = vfnmadd213ps_avx512vl(auVar100,auVar95,auVar93);
    auVar100 = vmulps_avx512vl(auVar92,auVar82);
    auVar92 = vfnmadd231ps_avx512vl(auVar100,auVar95,auVar90);
    auVar100 = vmulps_avx512vl(auVar101,auVar82);
    auVar101 = vfnmadd231ps_avx512vl(auVar100,auVar95,auVar83);
    auVar100 = vmulps_avx512vl(auVar94,auVar82);
    auVar94 = vfnmadd213ps_avx512vl(auVar195,auVar95,auVar100);
    auVar100 = vmulps_avx512vl(auVar88,auVar82);
    auVar83 = vfnmadd213ps_avx512vl(auVar87,auVar95,auVar100);
    auVar87 = vmulps_avx512vl(auVar85,auVar82);
    auVar91 = vfnmadd231ps_avx512vl(auVar87,auVar91,auVar95);
    auVar100 = vminps_avx(auVar96,auVar84);
    auVar87 = vmaxps_avx(auVar96,auVar84);
    auVar90 = vminps_avx(auVar93,auVar92);
    auVar90 = vminps_avx(auVar100,auVar90);
    auVar100 = vmaxps_avx(auVar93,auVar92);
    auVar87 = vmaxps_avx(auVar87,auVar100);
    auVar88 = vminps_avx(auVar101,auVar94);
    auVar100 = vmaxps_avx(auVar101,auVar94);
    auVar101 = vminps_avx(auVar83,auVar91);
    auVar88 = vminps_avx(auVar88,auVar101);
    auVar88 = vminps_avx(auVar90,auVar88);
    auVar90 = vmaxps_avx(auVar83,auVar91);
    auVar100 = vmaxps_avx(auVar100,auVar90);
    auVar87 = vmaxps_avx(auVar87,auVar100);
    uVar13 = vcmpps_avx512vl(auVar87,auVar86,5);
    uVar14 = vcmpps_avx512vl(auVar88,auVar89,2);
    bVar24 = bVar24 & (byte)uVar13 & (byte)uVar14;
    if (bVar24 != 0) {
      mask_stack[uVar29] = (uint)bVar24;
      BVar2 = (BBox1f)vmovlps_avx(auVar45);
      cu_stack[uVar29] = BVar2;
      BVar2 = (BBox1f)vmovlps_avx(auVar76);
      cv_stack[uVar29] = BVar2;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
  }
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar234 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar45);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT3264(auVar87);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar238 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar239 = ZEXT1664(auVar45);
  auVar240 = ZEXT3264(_DAT_01fb9fe0);
LAB_019c4c20:
  do {
    do {
      do {
        if ((int)uVar29 == 0) {
          if (bVar31) goto LAB_019c5b56;
          uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar16._4_4_ = uVar125;
          auVar16._0_4_ = uVar125;
          auVar16._8_4_ = uVar125;
          auVar16._12_4_ = uVar125;
          auVar16._16_4_ = uVar125;
          auVar16._20_4_ = uVar125;
          auVar16._24_4_ = uVar125;
          auVar16._28_4_ = uVar125;
          uVar13 = vcmpps_avx512vl(local_78,auVar16,2);
          local_360 = (ulong)((uint)uVar32 & (uint)uVar13);
          goto LAB_019c3fd2;
        }
        uVar25 = (int)uVar29 - 1;
        uVar7 = mask_stack[uVar25];
        auVar76._8_8_ = 0;
        auVar76._0_4_ = cv_stack[uVar25].lower;
        auVar76._4_4_ = cv_stack[uVar25].upper;
        uVar30 = 0;
        for (uVar28 = (ulong)uVar7; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          uVar30 = uVar30 + 1;
        }
        uVar27 = uVar7 - 1 & uVar7;
        bVar35 = uVar27 == 0;
        mask_stack[uVar25] = uVar27;
        if (bVar35) {
          uVar29 = (ulong)uVar25;
        }
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar30;
        auVar45 = vpunpcklqdq_avx(auVar118,ZEXT416((int)uVar30 + 1));
        auVar45 = vcvtqq2ps_avx512vl(auVar45);
        auVar45 = vmulps_avx512vl(auVar45,auVar238._0_16_);
        fVar117 = cu_stack[uVar25].upper;
        auVar79._4_4_ = fVar117;
        auVar79._0_4_ = fVar117;
        auVar79._8_4_ = fVar117;
        auVar79._12_4_ = fVar117;
        auVar68 = vmulps_avx512vl(auVar45,auVar79);
        auVar173 = auVar239._0_16_;
        auVar45 = vsubps_avx512vl(auVar173,auVar45);
        fVar117 = cu_stack[uVar25].lower;
        auVar80._4_4_ = fVar117;
        auVar80._0_4_ = fVar117;
        auVar80._8_4_ = fVar117;
        auVar80._12_4_ = fVar117;
        auVar45 = vfmadd231ps_avx512vl(auVar68,auVar45,auVar80);
        auVar68 = vmovshdup_avx(auVar45);
        fVar117 = auVar68._0_4_ - auVar45._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar117));
        if (uVar7 == 0 || bVar35) goto LAB_019c4725;
        auVar68 = vshufps_avx(auVar76,auVar76,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar117));
        auVar66 = vsubps_avx512vl(auVar173,auVar68);
        fVar197 = auVar68._0_4_;
        auVar154._0_4_ = fVar197 * fVar122;
        fVar207 = auVar68._4_4_;
        auVar154._4_4_ = fVar207 * fVar123;
        fVar209 = auVar68._8_4_;
        auVar154._8_4_ = fVar209 * fVar122;
        fVar206 = auVar68._12_4_;
        auVar154._12_4_ = fVar206 * fVar123;
        auVar161._0_4_ = fVar197 * fVar124;
        auVar161._4_4_ = fVar207 * fVar135;
        auVar161._8_4_ = fVar209 * fVar124;
        auVar161._12_4_ = fVar206 * fVar135;
        auVar167._0_4_ = fVar197 * fVar151;
        auVar167._4_4_ = fVar207 * fVar152;
        auVar167._8_4_ = fVar209 * fVar151;
        auVar167._12_4_ = fVar206 * fVar152;
        auVar140._0_4_ = fVar197 * fVar153;
        auVar140._4_4_ = fVar207 * fVar196;
        auVar140._8_4_ = fVar209 * fVar153;
        auVar140._12_4_ = fVar206 * fVar196;
        auVar68 = vfmadd231ps_fma(auVar154,auVar66,auVar166);
        auVar67 = vfmadd231ps_fma(auVar161,auVar66,auVar43);
        auVar65 = vfmadd231ps_fma(auVar167,auVar66,auVar56);
        auVar66 = vfmadd231ps_fma(auVar140,auVar66,auVar181);
        auVar150._16_16_ = auVar68;
        auVar150._0_16_ = auVar68;
        auVar159._16_16_ = auVar67;
        auVar159._0_16_ = auVar67;
        auVar165._16_16_ = auVar65;
        auVar165._0_16_ = auVar65;
        auVar100 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar45));
        auVar87 = vsubps_avx(auVar159,auVar150);
        auVar67 = vfmadd213ps_fma(auVar87,auVar100,auVar150);
        auVar87 = vsubps_avx(auVar165,auVar159);
        auVar78 = vfmadd213ps_fma(auVar87,auVar100,auVar159);
        auVar68 = vsubps_avx(auVar66,auVar65);
        auVar160._16_16_ = auVar68;
        auVar160._0_16_ = auVar68;
        auVar68 = vfmadd213ps_fma(auVar160,auVar100,auVar165);
        auVar87 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar87,auVar100,ZEXT1632(auVar67));
        auVar87 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar78));
        auVar68 = vfmadd213ps_fma(auVar87,auVar100,ZEXT1632(auVar78));
        auVar87 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar67));
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar87,auVar100);
        auVar87 = vmulps_avx512vl(auVar87,auVar237._0_32_);
        auVar106._16_16_ = auVar87._16_16_;
        fVar197 = fVar117 * 0.33333334;
        auVar168._0_8_ =
             CONCAT44(auVar146._4_4_ + fVar197 * auVar87._4_4_,
                      auVar146._0_4_ + fVar197 * auVar87._0_4_);
        auVar168._8_4_ = auVar146._8_4_ + fVar197 * auVar87._8_4_;
        auVar168._12_4_ = auVar146._12_4_ + fVar197 * auVar87._12_4_;
        auVar155._0_4_ = fVar197 * auVar87._16_4_;
        auVar155._4_4_ = fVar197 * auVar87._20_4_;
        auVar155._8_4_ = fVar197 * auVar87._24_4_;
        auVar155._12_4_ = fVar197 * auVar87._28_4_;
        auVar75 = vsubps_avx((undefined1  [16])0x0,auVar155);
        auVar78 = vshufpd_avx(auVar146,auVar146,3);
        auVar81 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar68 = vsubps_avx(auVar78,auVar146);
        auVar67 = vsubps_avx(auVar81,(undefined1  [16])0x0);
        auVar182._0_4_ = auVar68._0_4_ + auVar67._0_4_;
        auVar182._4_4_ = auVar68._4_4_ + auVar67._4_4_;
        auVar182._8_4_ = auVar68._8_4_ + auVar67._8_4_;
        auVar182._12_4_ = auVar68._12_4_ + auVar67._12_4_;
        auVar68 = vshufps_avx(auVar146,auVar146,0xb1);
        auVar67 = vshufps_avx(auVar168,auVar168,0xb1);
        auVar65 = vshufps_avx(auVar75,auVar75,0xb1);
        auVar66 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar226._4_4_ = auVar182._0_4_;
        auVar226._0_4_ = auVar182._0_4_;
        auVar226._8_4_ = auVar182._0_4_;
        auVar226._12_4_ = auVar182._0_4_;
        auVar71 = vshufps_avx(auVar182,auVar182,0x55);
        fVar197 = auVar71._0_4_;
        auVar191._0_4_ = auVar68._0_4_ * fVar197;
        fVar207 = auVar71._4_4_;
        auVar191._4_4_ = auVar68._4_4_ * fVar207;
        fVar209 = auVar71._8_4_;
        auVar191._8_4_ = auVar68._8_4_ * fVar209;
        fVar206 = auVar71._12_4_;
        auVar191._12_4_ = auVar68._12_4_ * fVar206;
        auVar198._0_4_ = auVar67._0_4_ * fVar197;
        auVar198._4_4_ = auVar67._4_4_ * fVar207;
        auVar198._8_4_ = auVar67._8_4_ * fVar209;
        auVar198._12_4_ = auVar67._12_4_ * fVar206;
        auVar212._0_4_ = auVar65._0_4_ * fVar197;
        auVar212._4_4_ = auVar65._4_4_ * fVar207;
        auVar212._8_4_ = auVar65._8_4_ * fVar209;
        auVar212._12_4_ = auVar65._12_4_ * fVar206;
        auVar183._0_4_ = auVar66._0_4_ * fVar197;
        auVar183._4_4_ = auVar66._4_4_ * fVar207;
        auVar183._8_4_ = auVar66._8_4_ * fVar209;
        auVar183._12_4_ = auVar66._12_4_ * fVar206;
        auVar68 = vfmadd231ps_fma(auVar191,auVar226,auVar146);
        auVar67 = vfmadd231ps_fma(auVar198,auVar226,auVar168);
        auVar73 = vfmadd231ps_fma(auVar212,auVar226,auVar75);
        auVar74 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar226);
        auVar71 = vshufpd_avx(auVar68,auVar68,1);
        auVar72 = vshufpd_avx(auVar67,auVar67,1);
        auVar69 = vshufpd_avx512vl(auVar73,auVar73,1);
        auVar70 = vshufpd_avx512vl(auVar74,auVar74,1);
        auVar65 = vminss_avx(auVar68,auVar67);
        auVar68 = vmaxss_avx(auVar67,auVar68);
        auVar66 = vminss_avx(auVar73,auVar74);
        auVar67 = vmaxss_avx(auVar74,auVar73);
        auVar65 = vminss_avx(auVar65,auVar66);
        auVar68 = vmaxss_avx(auVar67,auVar68);
        auVar66 = vminss_avx(auVar71,auVar72);
        auVar67 = vmaxss_avx(auVar72,auVar71);
        auVar71 = vminss_avx512f(auVar69,auVar70);
        auVar72 = vmaxss_avx512f(auVar70,auVar69);
        auVar67 = vmaxss_avx(auVar72,auVar67);
        auVar66 = vminss_avx512f(auVar66,auVar71);
        fVar207 = auVar67._0_4_;
        fVar197 = auVar68._0_4_;
        if (auVar65._0_4_ < 0.0001) {
          bVar36 = fVar207 == -0.0001;
          bVar33 = NAN(fVar207);
          if (fVar207 <= -0.0001) goto LAB_019c4e4a;
          break;
        }
LAB_019c4e4a:
        vucomiss_avx512f(auVar66);
        bVar36 = fVar207 <= -0.0001;
        bVar34 = -0.0001 < fVar197;
        bVar33 = bVar36;
        if (!bVar36) break;
        uVar13 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar66,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar25 = (uint)uVar13 & (uint)uVar14;
        bVar22 = (uVar25 & 1) == 0;
        bVar36 = bVar34 && bVar22;
        bVar33 = bVar34 && (uVar25 & 1) == 0;
      } while (!bVar34 || !bVar22);
      auVar73 = auVar242._0_16_;
      vcmpss_avx512f(auVar65,auVar73,1);
      uVar13 = vcmpss_avx512f(auVar68,auVar73,1);
      bVar34 = (bool)((byte)uVar13 & 1);
      auVar106._0_16_ = auVar243._0_16_;
      auVar105._4_28_ = auVar106._4_28_;
      auVar105._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar243._0_4_);
      vucomiss_avx512f(auVar105._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar34 = bVar33 == false;
      auVar108._16_16_ = auVar106._16_16_;
      auVar108._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar107._4_28_ = auVar108._4_28_;
      auVar107._0_4_ = (uint)bVar33 * auVar242._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar72 = auVar107._0_16_;
      auVar110._16_16_ = auVar106._16_16_;
      auVar110._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar109._4_28_ = auVar110._4_28_;
      auVar109._0_4_ = (uint)bVar33 * auVar242._0_4_ + (uint)!bVar33 * -0x800000;
      auVar71 = auVar109._0_16_;
      uVar13 = vcmpss_avx512f(auVar66,auVar73,1);
      bVar36 = (bool)((byte)uVar13 & 1);
      auVar112._16_16_ = auVar106._16_16_;
      auVar112._0_16_ = auVar243._0_16_;
      auVar111._4_28_ = auVar112._4_28_;
      auVar111._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar243._0_4_);
      vucomiss_avx512f(auVar111._0_16_);
      if ((bVar33) || (bVar34)) {
        auVar66 = vucomiss_avx512f(auVar65);
        if ((bVar33) || (bVar34)) {
          auVar74 = vxorps_avx512vl(auVar65,auVar236._0_16_);
          auVar65 = vsubss_avx512f(auVar66,auVar65);
          auVar65 = vdivss_avx512f(auVar74,auVar65);
          auVar66 = vsubss_avx512f(ZEXT416(0x3f800000),auVar65);
          auVar66 = vfmadd213ss_avx512f(auVar66,auVar73,auVar65);
          auVar65 = auVar66;
        }
        else {
          auVar65 = vxorps_avx512vl(auVar66,auVar66);
          vucomiss_avx512f(auVar65);
          auVar66 = ZEXT416(0x3f800000);
          if ((bVar33) || (bVar34)) {
            auVar66 = SUB6416(ZEXT464(0xff800000),0);
            auVar65 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar72 = vminss_avx512f(auVar72,auVar65);
        auVar71 = vmaxss_avx(auVar66,auVar71);
      }
      auVar243 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar67,auVar73,1);
      bVar36 = (bool)((byte)uVar13 & 1);
      auVar67 = auVar243._0_16_;
      fVar209 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * 0x3f800000);
      if ((auVar105._0_4_ != fVar209) || (NAN(auVar105._0_4_) || NAN(fVar209))) {
        if ((fVar207 != fVar197) || (NAN(fVar207) || NAN(fVar197))) {
          auVar68 = vxorps_avx512vl(auVar68,auVar236._0_16_);
          auVar184._0_4_ = auVar68._0_4_ / (fVar207 - fVar197);
          auVar184._4_12_ = auVar68._4_12_;
          auVar68 = vsubss_avx512f(auVar67,auVar184);
          auVar68 = vfmadd213ss_avx512f(auVar68,auVar73,auVar184);
          auVar65 = auVar68;
        }
        else if ((fVar197 != 0.0) ||
                (auVar68 = auVar67, auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar197))) {
          auVar68 = SUB6416(ZEXT464(0xff800000),0);
          auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar72 = vminss_avx(auVar72,auVar65);
        auVar71 = vmaxss_avx(auVar68,auVar71);
      }
      bVar36 = auVar111._0_4_ != fVar209;
      auVar68 = vminss_avx512f(auVar72,auVar67);
      auVar114._16_16_ = auVar106._16_16_;
      auVar114._0_16_ = auVar72;
      auVar113._4_28_ = auVar114._4_28_;
      auVar113._0_4_ = (uint)bVar36 * auVar68._0_4_ + (uint)!bVar36 * auVar72._0_4_;
      auVar68 = vmaxss_avx512f(auVar67,auVar71);
      auVar116._16_16_ = auVar106._16_16_;
      auVar116._0_16_ = auVar71;
      auVar115._4_28_ = auVar116._4_28_;
      auVar115._0_4_ = (uint)bVar36 * auVar68._0_4_ + (uint)!bVar36 * auVar71._0_4_;
      auVar68 = vmaxss_avx512f(auVar73,auVar113._0_16_);
      auVar65 = vminss_avx512f(auVar115._0_16_,auVar67);
    } while (auVar65._0_4_ < auVar68._0_4_);
    auVar73 = vmaxss_avx512f(auVar73,ZEXT416((uint)(auVar68._0_4_ + -0.1)));
    auVar74 = vminss_avx512f(ZEXT416((uint)(auVar65._0_4_ + 0.1)),auVar67);
    auVar141._0_8_ = auVar146._0_8_;
    auVar141._8_8_ = auVar141._0_8_;
    auVar199._8_8_ = auVar168._0_8_;
    auVar199._0_8_ = auVar168._0_8_;
    auVar213._8_8_ = auVar75._0_8_;
    auVar213._0_8_ = auVar75._0_8_;
    auVar68 = vshufpd_avx(auVar168,auVar168,3);
    auVar65 = vshufpd_avx(auVar75,auVar75,3);
    auVar66 = vshufps_avx(auVar73,auVar74,0);
    auVar72 = vsubps_avx512vl(auVar173,auVar66);
    fVar197 = auVar66._0_4_;
    auVar162._0_4_ = fVar197 * auVar78._0_4_;
    fVar207 = auVar66._4_4_;
    auVar162._4_4_ = fVar207 * auVar78._4_4_;
    fVar209 = auVar66._8_4_;
    auVar162._8_4_ = fVar209 * auVar78._8_4_;
    fVar206 = auVar66._12_4_;
    auVar162._12_4_ = fVar206 * auVar78._12_4_;
    auVar169._0_4_ = fVar197 * auVar68._0_4_;
    auVar169._4_4_ = fVar207 * auVar68._4_4_;
    auVar169._8_4_ = fVar209 * auVar68._8_4_;
    auVar169._12_4_ = fVar206 * auVar68._12_4_;
    auVar229._0_4_ = auVar65._0_4_ * fVar197;
    auVar229._4_4_ = auVar65._4_4_ * fVar207;
    auVar229._8_4_ = auVar65._8_4_ * fVar209;
    auVar229._12_4_ = auVar65._12_4_ * fVar206;
    auVar156._0_4_ = fVar197 * auVar81._0_4_;
    auVar156._4_4_ = fVar207 * auVar81._4_4_;
    auVar156._8_4_ = fVar209 * auVar81._8_4_;
    auVar156._12_4_ = fVar206 * auVar81._12_4_;
    auVar78 = vfmadd231ps_fma(auVar162,auVar72,auVar141);
    auVar81 = vfmadd231ps_fma(auVar169,auVar72,auVar199);
    auVar71 = vfmadd231ps_fma(auVar229,auVar72,auVar213);
    auVar72 = vfmadd231ps_fma(auVar156,auVar72,ZEXT816(0));
    auVar65 = vsubss_avx512f(auVar67,auVar73);
    auVar68 = vmovshdup_avx(auVar76);
    auVar146 = vfmadd231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar73._0_4_)),auVar76,auVar65);
    auVar65 = vsubss_avx512f(auVar67,auVar74);
    auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar74._0_4_)),auVar76,auVar65);
    auVar75 = vdivss_avx512f(auVar67,ZEXT416((uint)fVar117));
    auVar76 = vsubps_avx(auVar81,auVar78);
    auVar118 = auVar234._0_16_;
    auVar65 = vmulps_avx512vl(auVar76,auVar118);
    auVar76 = vsubps_avx(auVar71,auVar81);
    auVar66 = vmulps_avx512vl(auVar76,auVar118);
    auVar76 = vsubps_avx(auVar72,auVar71);
    auVar76 = vmulps_avx512vl(auVar76,auVar118);
    auVar68 = vminps_avx(auVar66,auVar76);
    auVar76 = vmaxps_avx(auVar66,auVar76);
    auVar68 = vminps_avx(auVar65,auVar68);
    auVar76 = vmaxps_avx(auVar65,auVar76);
    auVar65 = vshufpd_avx(auVar68,auVar68,3);
    auVar66 = vshufpd_avx(auVar76,auVar76,3);
    auVar68 = vminps_avx(auVar68,auVar65);
    auVar76 = vmaxps_avx(auVar76,auVar66);
    fVar117 = auVar75._0_4_;
    auVar185._0_4_ = auVar68._0_4_ * fVar117;
    auVar185._4_4_ = auVar68._4_4_ * fVar117;
    auVar185._8_4_ = auVar68._8_4_ * fVar117;
    auVar185._12_4_ = auVar68._12_4_ * fVar117;
    auVar174._0_4_ = fVar117 * auVar76._0_4_;
    auVar174._4_4_ = fVar117 * auVar76._4_4_;
    auVar174._8_4_ = fVar117 * auVar76._8_4_;
    auVar174._12_4_ = fVar117 * auVar76._12_4_;
    auVar75 = vdivss_avx512f(auVar67,ZEXT416((uint)(auVar69._0_4_ - auVar146._0_4_)));
    auVar76 = vshufpd_avx(auVar78,auVar78,3);
    auVar68 = vshufpd_avx(auVar81,auVar81,3);
    auVar65 = vshufpd_avx(auVar71,auVar71,3);
    auVar66 = vshufpd_avx(auVar72,auVar72,3);
    auVar76 = vsubps_avx(auVar76,auVar78);
    auVar78 = vsubps_avx(auVar68,auVar81);
    auVar81 = vsubps_avx(auVar65,auVar71);
    auVar66 = vsubps_avx(auVar66,auVar72);
    auVar68 = vminps_avx(auVar76,auVar78);
    auVar76 = vmaxps_avx(auVar76,auVar78);
    auVar65 = vminps_avx(auVar81,auVar66);
    auVar65 = vminps_avx(auVar68,auVar65);
    auVar68 = vmaxps_avx(auVar81,auVar66);
    auVar76 = vmaxps_avx(auVar76,auVar68);
    fVar117 = auVar75._0_4_;
    auVar214._0_4_ = fVar117 * auVar65._0_4_;
    auVar214._4_4_ = fVar117 * auVar65._4_4_;
    auVar214._8_4_ = fVar117 * auVar65._8_4_;
    auVar214._12_4_ = fVar117 * auVar65._12_4_;
    auVar200._0_4_ = fVar117 * auVar76._0_4_;
    auVar200._4_4_ = fVar117 * auVar76._4_4_;
    auVar200._8_4_ = fVar117 * auVar76._8_4_;
    auVar200._12_4_ = fVar117 * auVar76._12_4_;
    auVar66 = vinsertps_avx(auVar45,auVar146,0x10);
    auVar70 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9f90,auVar69);
    auVar128._0_4_ = auVar66._0_4_ + auVar70._0_4_;
    auVar128._4_4_ = auVar66._4_4_ + auVar70._4_4_;
    auVar128._8_4_ = auVar66._8_4_ + auVar70._8_4_;
    auVar128._12_4_ = auVar66._12_4_ + auVar70._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar75 = vmulps_avx512vl(auVar128,auVar15);
    auVar68 = vshufps_avx(auVar75,auVar75,0x54);
    uVar125 = auVar75._0_4_;
    auVar129._4_4_ = uVar125;
    auVar129._0_4_ = uVar125;
    auVar129._8_4_ = uVar125;
    auVar129._12_4_ = uVar125;
    auVar65 = vfmadd213ps_fma(auVar58,auVar129,auVar44);
    auVar78 = vfmadd213ps_fma(auVar59,auVar129,auVar39);
    auVar81 = vfmadd213ps_fma(auVar60,auVar129,auVar126);
    auVar76 = vsubps_avx(auVar78,auVar65);
    auVar65 = vfmadd213ps_fma(auVar76,auVar129,auVar65);
    auVar76 = vsubps_avx(auVar81,auVar78);
    auVar76 = vfmadd213ps_fma(auVar76,auVar129,auVar78);
    auVar76 = vsubps_avx(auVar76,auVar65);
    auVar65 = vfmadd231ps_fma(auVar65,auVar76,auVar129);
    auVar71 = vmulps_avx512vl(auVar76,auVar118);
    auVar222._8_8_ = auVar65._0_8_;
    auVar222._0_8_ = auVar65._0_8_;
    auVar76 = vshufpd_avx(auVar65,auVar65,3);
    auVar65 = vshufps_avx(auVar75,auVar75,0x55);
    auVar78 = vsubps_avx(auVar76,auVar222);
    auVar81 = vfmadd231ps_fma(auVar222,auVar65,auVar78);
    auVar230._8_8_ = auVar71._0_8_;
    auVar230._0_8_ = auVar71._0_8_;
    auVar76 = vshufpd_avx(auVar71,auVar71,3);
    auVar76 = vsubps_avx512vl(auVar76,auVar230);
    auVar76 = vfmadd213ps_avx512vl(auVar76,auVar65,auVar230);
    auVar130._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
    auVar130._8_4_ = auVar78._8_4_ ^ 0x80000000;
    auVar130._12_4_ = auVar78._12_4_ ^ 0x80000000;
    auVar65 = vmovshdup_avx512vl(auVar76);
    auVar231._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
    auVar231._8_4_ = auVar65._8_4_ ^ 0x80000000;
    auVar231._12_4_ = auVar65._12_4_ ^ 0x80000000;
    auVar71 = vmovshdup_avx512vl(auVar78);
    auVar72 = vpermt2ps_avx512vl(auVar231,ZEXT416(5),auVar78);
    auVar77 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar242 = ZEXT1664(auVar77);
    auVar65 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar65._0_4_ * auVar78._0_4_)),auVar76,auVar71);
    auVar78 = vpermt2ps_avx512vl(auVar76,SUB6416(ZEXT464(4),0),auVar130);
    auVar157._0_4_ = auVar65._0_4_;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar76 = vdivps_avx(auVar72,auVar157);
    auVar79 = vdivps_avx512vl(auVar78,auVar157);
    fVar117 = auVar81._0_4_;
    auVar65 = vshufps_avx(auVar81,auVar81,0x55);
    auVar223._0_4_ = fVar117 * auVar76._0_4_ + auVar65._0_4_ * auVar79._0_4_;
    auVar223._4_4_ = fVar117 * auVar76._4_4_ + auVar65._4_4_ * auVar79._4_4_;
    auVar223._8_4_ = fVar117 * auVar76._8_4_ + auVar65._8_4_ * auVar79._8_4_;
    auVar223._12_4_ = fVar117 * auVar76._12_4_ + auVar65._12_4_ * auVar79._12_4_;
    auVar73 = vsubps_avx(auVar68,auVar223);
    auVar65 = vmovshdup_avx(auVar76);
    auVar68 = vinsertps_avx(auVar185,auVar214,0x1c);
    auVar232._0_4_ = auVar65._0_4_ * auVar68._0_4_;
    auVar232._4_4_ = auVar65._4_4_ * auVar68._4_4_;
    auVar232._8_4_ = auVar65._8_4_ * auVar68._8_4_;
    auVar232._12_4_ = auVar65._12_4_ * auVar68._12_4_;
    auVar74 = vinsertps_avx512f(auVar174,auVar200,0x1c);
    auVar65 = vmulps_avx512vl(auVar65,auVar74);
    auVar72 = vminps_avx512vl(auVar232,auVar65);
    auVar81 = vmaxps_avx(auVar65,auVar232);
    auVar71 = vmovshdup_avx(auVar79);
    auVar65 = vinsertps_avx(auVar214,auVar185,0x4c);
    auVar215._0_4_ = auVar71._0_4_ * auVar65._0_4_;
    auVar215._4_4_ = auVar71._4_4_ * auVar65._4_4_;
    auVar215._8_4_ = auVar71._8_4_ * auVar65._8_4_;
    auVar215._12_4_ = auVar71._12_4_ * auVar65._12_4_;
    auVar78 = vinsertps_avx(auVar200,auVar174,0x4c);
    auVar201._0_4_ = auVar71._0_4_ * auVar78._0_4_;
    auVar201._4_4_ = auVar71._4_4_ * auVar78._4_4_;
    auVar201._8_4_ = auVar71._8_4_ * auVar78._8_4_;
    auVar201._12_4_ = auVar71._12_4_ * auVar78._12_4_;
    auVar71 = vminps_avx(auVar215,auVar201);
    auVar72 = vaddps_avx512vl(auVar72,auVar71);
    auVar71 = vmaxps_avx(auVar201,auVar215);
    auVar202._0_4_ = auVar81._0_4_ + auVar71._0_4_;
    auVar202._4_4_ = auVar81._4_4_ + auVar71._4_4_;
    auVar202._8_4_ = auVar81._8_4_ + auVar71._8_4_;
    auVar202._12_4_ = auVar81._12_4_ + auVar71._12_4_;
    auVar216._8_8_ = 0x3f80000000000000;
    auVar216._0_8_ = 0x3f80000000000000;
    auVar81 = vsubps_avx(auVar216,auVar202);
    auVar71 = vsubps_avx(auVar216,auVar72);
    auVar72 = vsubps_avx(auVar66,auVar75);
    auVar75 = vsubps_avx(auVar70,auVar75);
    fVar206 = auVar72._0_4_;
    auVar233._0_4_ = fVar206 * auVar81._0_4_;
    fVar208 = auVar72._4_4_;
    auVar233._4_4_ = fVar208 * auVar81._4_4_;
    fVar210 = auVar72._8_4_;
    auVar233._8_4_ = fVar210 * auVar81._8_4_;
    fVar211 = auVar72._12_4_;
    auVar233._12_4_ = fVar211 * auVar81._12_4_;
    auVar80 = vbroadcastss_avx512vl(auVar76);
    auVar68 = vmulps_avx512vl(auVar80,auVar68);
    auVar74 = vmulps_avx512vl(auVar80,auVar74);
    auVar80 = vminps_avx512vl(auVar68,auVar74);
    auVar74 = vmaxps_avx512vl(auVar74,auVar68);
    auVar68 = vbroadcastss_avx512vl(auVar79);
    auVar65 = vmulps_avx512vl(auVar68,auVar65);
    auVar68 = vmulps_avx512vl(auVar68,auVar78);
    auVar78 = vminps_avx512vl(auVar65,auVar68);
    auVar78 = vaddps_avx512vl(auVar80,auVar78);
    auVar72 = vmulps_avx512vl(auVar72,auVar71);
    fVar117 = auVar75._0_4_;
    auVar203._0_4_ = fVar117 * auVar81._0_4_;
    fVar197 = auVar75._4_4_;
    auVar203._4_4_ = fVar197 * auVar81._4_4_;
    fVar207 = auVar75._8_4_;
    auVar203._8_4_ = fVar207 * auVar81._8_4_;
    fVar209 = auVar75._12_4_;
    auVar203._12_4_ = fVar209 * auVar81._12_4_;
    auVar217._0_4_ = fVar117 * auVar71._0_4_;
    auVar217._4_4_ = fVar197 * auVar71._4_4_;
    auVar217._8_4_ = fVar207 * auVar71._8_4_;
    auVar217._12_4_ = fVar209 * auVar71._12_4_;
    auVar68 = vmaxps_avx(auVar68,auVar65);
    auVar175._0_4_ = auVar74._0_4_ + auVar68._0_4_;
    auVar175._4_4_ = auVar74._4_4_ + auVar68._4_4_;
    auVar175._8_4_ = auVar74._8_4_ + auVar68._8_4_;
    auVar175._12_4_ = auVar74._12_4_ + auVar68._12_4_;
    auVar186._8_8_ = 0x3f800000;
    auVar186._0_8_ = 0x3f800000;
    auVar68 = vsubps_avx(auVar186,auVar175);
    auVar65 = vsubps_avx512vl(auVar186,auVar78);
    auVar227._0_4_ = fVar206 * auVar68._0_4_;
    auVar227._4_4_ = fVar208 * auVar68._4_4_;
    auVar227._8_4_ = fVar210 * auVar68._8_4_;
    auVar227._12_4_ = fVar211 * auVar68._12_4_;
    auVar224._0_4_ = fVar206 * auVar65._0_4_;
    auVar224._4_4_ = fVar208 * auVar65._4_4_;
    auVar224._8_4_ = fVar210 * auVar65._8_4_;
    auVar224._12_4_ = fVar211 * auVar65._12_4_;
    auVar176._0_4_ = fVar117 * auVar68._0_4_;
    auVar176._4_4_ = fVar197 * auVar68._4_4_;
    auVar176._8_4_ = fVar207 * auVar68._8_4_;
    auVar176._12_4_ = fVar209 * auVar68._12_4_;
    auVar187._0_4_ = fVar117 * auVar65._0_4_;
    auVar187._4_4_ = fVar197 * auVar65._4_4_;
    auVar187._8_4_ = fVar207 * auVar65._8_4_;
    auVar187._12_4_ = fVar209 * auVar65._12_4_;
    auVar68 = vminps_avx(auVar227,auVar224);
    auVar65 = vminps_avx512vl(auVar176,auVar187);
    auVar78 = vminps_avx512vl(auVar68,auVar65);
    auVar68 = vmaxps_avx(auVar224,auVar227);
    auVar65 = vmaxps_avx(auVar187,auVar176);
    auVar65 = vmaxps_avx(auVar65,auVar68);
    auVar81 = vminps_avx512vl(auVar233,auVar72);
    auVar68 = vminps_avx(auVar203,auVar217);
    auVar68 = vminps_avx(auVar81,auVar68);
    auVar68 = vhaddps_avx(auVar78,auVar68);
    auVar81 = vmaxps_avx512vl(auVar72,auVar233);
    auVar78 = vmaxps_avx(auVar217,auVar203);
    auVar78 = vmaxps_avx(auVar78,auVar81);
    auVar65 = vhaddps_avx(auVar65,auVar78);
    auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
    auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
    auVar177._0_4_ = auVar68._0_4_ + auVar73._0_4_;
    auVar177._4_4_ = auVar68._4_4_ + auVar73._4_4_;
    auVar177._8_4_ = auVar68._8_4_ + auVar73._8_4_;
    auVar177._12_4_ = auVar68._12_4_ + auVar73._12_4_;
    auVar188._0_4_ = auVar65._0_4_ + auVar73._0_4_;
    auVar188._4_4_ = auVar65._4_4_ + auVar73._4_4_;
    auVar188._8_4_ = auVar65._8_4_ + auVar73._8_4_;
    auVar188._12_4_ = auVar65._12_4_ + auVar73._12_4_;
    auVar68 = vmaxps_avx(auVar66,auVar177);
    auVar65 = vminps_avx(auVar188,auVar70);
    uVar30 = vcmpps_avx512vl(auVar65,auVar68,1);
  } while ((uVar30 & 3) != 0);
  uVar30 = vcmpps_avx512vl(auVar188,auVar70,1);
  uVar13 = vcmpps_avx512vl(auVar45,auVar177,1);
  if (((ushort)uVar13 & (ushort)uVar30 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar68 = vmovshdup_avx(auVar177);
    bVar24 = auVar146._0_4_ < auVar68._0_4_ & (byte)(uVar30 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar127._0_4_;
  p03.field_0.i[1] = auVar127._4_4_;
  p03.field_0.i[2] = auVar127._8_4_;
  p03.field_0.i[3] = auVar127._12_4_;
  if (((3 < (uint)uVar29 || uVar7 != 0 && !bVar35) | bVar24) != 1) goto LAB_019c5ad2;
  lVar26 = 0xc9;
  do {
    lVar26 = lVar26 + -1;
    if (lVar26 == 0) goto LAB_019c4c20;
    auVar45 = vsubss_avx512f(auVar67,auVar73);
    fVar207 = auVar45._0_4_;
    fVar117 = fVar207 * fVar207 * fVar207;
    fVar209 = auVar73._0_4_;
    fVar197 = fVar209 * 3.0 * fVar207 * fVar207;
    fVar207 = fVar207 * fVar209 * fVar209 * 3.0;
    auVar147._4_4_ = fVar117;
    auVar147._0_4_ = fVar117;
    auVar147._8_4_ = fVar117;
    auVar147._12_4_ = fVar117;
    auVar142._4_4_ = fVar197;
    auVar142._0_4_ = fVar197;
    auVar142._8_4_ = fVar197;
    auVar142._12_4_ = fVar197;
    auVar119._4_4_ = fVar207;
    auVar119._0_4_ = fVar207;
    auVar119._8_4_ = fVar207;
    auVar119._12_4_ = fVar207;
    fVar209 = fVar209 * fVar209 * fVar209;
    auVar163._0_4_ = p03.field_0.v[0] * fVar209;
    auVar163._4_4_ = p03.field_0.v[1] * fVar209;
    auVar163._8_4_ = p03.field_0.v[2] * fVar209;
    auVar163._12_4_ = p03.field_0.v[3] * fVar209;
    auVar45 = vfmadd231ps_fma(auVar163,auVar126,auVar119);
    auVar45 = vfmadd231ps_fma(auVar45,auVar39,auVar142);
    auVar45 = vfmadd231ps_fma(auVar45,auVar44,auVar147);
    auVar120._8_8_ = auVar45._0_8_;
    auVar120._0_8_ = auVar45._0_8_;
    auVar45 = vshufpd_avx(auVar45,auVar45,3);
    auVar68 = vshufps_avx(auVar73,auVar73,0x55);
    auVar45 = vsubps_avx(auVar45,auVar120);
    auVar68 = vfmadd213ps_fma(auVar45,auVar68,auVar120);
    fVar117 = auVar68._0_4_;
    auVar45 = vshufps_avx(auVar68,auVar68,0x55);
    auVar121._0_4_ = auVar76._0_4_ * fVar117 + auVar79._0_4_ * auVar45._0_4_;
    auVar121._4_4_ = auVar76._4_4_ * fVar117 + auVar79._4_4_ * auVar45._4_4_;
    auVar121._8_4_ = auVar76._8_4_ * fVar117 + auVar79._8_4_ * auVar45._8_4_;
    auVar121._12_4_ = auVar76._12_4_ * fVar117 + auVar79._12_4_ * auVar45._12_4_;
    auVar73 = vsubps_avx(auVar73,auVar121);
    auVar45 = vandps_avx512vl(auVar68,auVar235._0_16_);
    auVar68 = vprolq_avx512vl(auVar45,0x20);
    auVar45 = vmaxss_avx(auVar68,auVar45);
    bVar35 = fVar172 < auVar45._0_4_;
  } while (fVar172 <= auVar45._0_4_);
  auVar45 = vucomiss_avx512f(auVar77);
  if (bVar35) goto LAB_019c4c20;
  auVar76 = vucomiss_avx512f(auVar45);
  auVar243 = ZEXT1664(auVar76);
  if (bVar35) goto LAB_019c4c20;
  vmovshdup_avx(auVar45);
  auVar76 = vucomiss_avx512f(auVar77);
  if (bVar35) goto LAB_019c4c20;
  auVar68 = vucomiss_avx512f(auVar76);
  auVar243 = ZEXT1664(auVar68);
  if (bVar35) goto LAB_019c4c20;
  auVar67 = vinsertps_avx(ZEXT416((uint)(pLVar23->vx).field_0.m128[2]),
                          ZEXT416(*(uint *)((long)&(pLVar23->vy).field_0 + 8)),0x1c);
  auVar75 = vinsertps_avx(auVar67,ZEXT416(*(uint *)((long)&(pLVar23->vz).field_0 + 8)),0x28);
  auVar67 = vdpps_avx(auVar75,auVar41,0x7f);
  auVar65 = vdpps_avx(auVar75,auVar51,0x7f);
  auVar66 = vdpps_avx(auVar75,auVar52,0x7f);
  auVar78 = vdpps_avx(auVar75,auVar38,0x7f);
  auVar81 = vdpps_avx(auVar75,auVar40,0x7f);
  auVar71 = vdpps_avx(auVar75,auVar53,0x7f);
  auVar72 = vdpps_avx(auVar75,auVar54,0x7f);
  auVar75 = vdpps_avx(auVar75,auVar55,0x7f);
  auVar73 = vsubss_avx512f(auVar68,auVar76);
  fVar117 = auVar76._0_4_;
  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * auVar81._0_4_)),auVar73,auVar67);
  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar117)),auVar73,auVar65);
  auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar117)),auVar73,auVar66);
  auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * auVar75._0_4_)),auVar73,auVar78);
  auVar68 = vsubss_avx512f(auVar68,auVar45);
  auVar170._0_4_ = auVar68._0_4_;
  fVar117 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
  local_d8 = auVar45._0_4_;
  fVar197 = local_d8 * 3.0 * auVar170._0_4_ * auVar170._0_4_;
  fVar207 = auVar170._0_4_ * local_d8 * local_d8 * 3.0;
  fVar209 = local_d8 * local_d8 * local_d8;
  auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar66._0_4_)),ZEXT416((uint)fVar207),auVar65)
  ;
  auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar197),auVar67);
  vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar117),auVar76);
  auVar76 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar35) goto LAB_019c4c20;
  fVar206 = *(float *)(ray + k * 4 + 0x80);
  if (fVar206 < auVar76._0_4_) goto LAB_019c4c20;
  local_c8 = vshufps_avx(auVar45,auVar45,0x55);
  auVar67 = vsubps_avx512vl(auVar173,local_c8);
  fVar208 = local_c8._0_4_;
  auVar189._0_4_ = fVar208 * auVar225._0_4_;
  fVar210 = local_c8._4_4_;
  auVar189._4_4_ = fVar210 * auVar225._4_4_;
  fVar211 = local_c8._8_4_;
  auVar189._8_4_ = fVar211 * auVar225._8_4_;
  fVar219 = local_c8._12_4_;
  auVar189._12_4_ = fVar219 * auVar225._12_4_;
  local_298 = auVar49._0_4_;
  fStack_294 = auVar49._4_4_;
  fStack_290 = auVar49._8_4_;
  fStack_28c = auVar49._12_4_;
  auVar192._0_4_ = fVar208 * local_298;
  auVar192._4_4_ = fVar210 * fStack_294;
  auVar192._8_4_ = fVar211 * fStack_290;
  auVar192._12_4_ = fVar219 * fStack_28c;
  local_2a8 = auVar50._0_4_;
  fStack_2a4 = auVar50._4_4_;
  fStack_2a0 = auVar50._8_4_;
  fStack_29c = auVar50._12_4_;
  auVar204._0_4_ = fVar208 * local_2a8;
  auVar204._4_4_ = fVar210 * fStack_2a4;
  auVar204._8_4_ = fVar211 * fStack_2a0;
  auVar204._12_4_ = fVar219 * fStack_29c;
  local_268 = auVar46._0_4_;
  fStack_264 = auVar46._4_4_;
  fStack_260 = auVar46._8_4_;
  fStack_25c = auVar46._12_4_;
  auVar218._0_4_ = fVar208 * local_268;
  auVar218._4_4_ = fVar210 * fStack_264;
  auVar218._8_4_ = fVar211 * fStack_260;
  auVar218._12_4_ = fVar219 * fStack_25c;
  auVar45 = vfmadd231ps_fma(auVar189,auVar67,auVar5);
  auVar68 = vfmadd231ps_fma(auVar192,auVar67,auVar47);
  auVar173 = vfmadd231ps_fma(auVar204,auVar67,auVar48);
  auVar67 = vfmadd231ps_fma(auVar218,auVar67,auVar42);
  auVar45 = vsubps_avx(auVar68,auVar45);
  auVar68 = vsubps_avx(auVar173,auVar68);
  auVar173 = vsubps_avx(auVar67,auVar173);
  auVar205._0_4_ = auVar68._0_4_ * local_d8;
  auVar205._4_4_ = auVar68._4_4_ * local_d8;
  auVar205._8_4_ = auVar68._8_4_ * local_d8;
  auVar205._12_4_ = auVar68._12_4_ * local_d8;
  auVar170._4_4_ = auVar170._0_4_;
  auVar170._8_4_ = auVar170._0_4_;
  auVar170._12_4_ = auVar170._0_4_;
  auVar45 = vfmadd231ps_fma(auVar205,auVar170,auVar45);
  auVar178._0_4_ = auVar173._0_4_ * local_d8;
  auVar178._4_4_ = auVar173._4_4_ * local_d8;
  auVar178._8_4_ = auVar173._8_4_ * local_d8;
  auVar178._12_4_ = auVar173._12_4_ * local_d8;
  auVar68 = vfmadd231ps_fma(auVar178,auVar170,auVar68);
  auVar179._0_4_ = auVar68._0_4_ * local_d8;
  auVar179._4_4_ = auVar68._4_4_ * local_d8;
  auVar179._8_4_ = auVar68._8_4_ * local_d8;
  auVar179._12_4_ = auVar68._12_4_ * local_d8;
  auVar45 = vfmadd231ps_fma(auVar179,auVar170,auVar45);
  auVar45 = vmulps_avx512vl(auVar45,auVar118);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar24 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019c5aca;
    local_2f8 = auVar63._0_4_;
    fStack_2f4 = auVar63._4_4_;
    fStack_2f0 = auVar63._8_4_;
    fStack_2ec = auVar63._12_4_;
    auVar164._0_4_ = fVar209 * local_2f8;
    auVar164._4_4_ = fVar209 * fStack_2f4;
    auVar164._8_4_ = fVar209 * fStack_2f0;
    auVar164._12_4_ = fVar209 * fStack_2ec;
    auVar148._4_4_ = fVar207;
    auVar148._0_4_ = fVar207;
    auVar148._8_4_ = fVar207;
    auVar148._12_4_ = fVar207;
    auVar68 = vfmadd132ps_fma(auVar148,auVar164,auVar62);
    auVar143._4_4_ = fVar197;
    auVar143._0_4_ = fVar197;
    auVar143._8_4_ = fVar197;
    auVar143._12_4_ = fVar197;
    auVar68 = vfmadd132ps_fma(auVar143,auVar68,auVar61);
    auVar131._4_4_ = fVar117;
    auVar131._0_4_ = fVar117;
    auVar131._8_4_ = fVar117;
    auVar131._12_4_ = fVar117;
    auVar67 = vfmadd132ps_fma(auVar131,auVar68,auVar37);
    auVar68 = vshufps_avx(auVar67,auVar67,0xc9);
    auVar173 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar132._0_4_ = auVar67._0_4_ * auVar173._0_4_;
    auVar132._4_4_ = auVar67._4_4_ * auVar173._4_4_;
    auVar132._8_4_ = auVar67._8_4_ * auVar173._8_4_;
    auVar132._12_4_ = auVar67._12_4_ * auVar173._12_4_;
    auVar68 = vfmsub231ps_fma(auVar132,auVar45,auVar68);
    auVar45 = vshufps_avx(auVar68,auVar68,0x55);
    local_f8 = vshufps_avx(auVar68,auVar68,0xaa);
    local_e8 = auVar68._0_4_;
    local_108[0] = (RTCHitN)auVar45[0];
    local_108[1] = (RTCHitN)auVar45[1];
    local_108[2] = (RTCHitN)auVar45[2];
    local_108[3] = (RTCHitN)auVar45[3];
    local_108[4] = (RTCHitN)auVar45[4];
    local_108[5] = (RTCHitN)auVar45[5];
    local_108[6] = (RTCHitN)auVar45[6];
    local_108[7] = (RTCHitN)auVar45[7];
    local_108[8] = (RTCHitN)auVar45[8];
    local_108[9] = (RTCHitN)auVar45[9];
    local_108[10] = (RTCHitN)auVar45[10];
    local_108[0xb] = (RTCHitN)auVar45[0xb];
    local_108[0xc] = (RTCHitN)auVar45[0xc];
    local_108[0xd] = (RTCHitN)auVar45[0xd];
    local_108[0xe] = (RTCHitN)auVar45[0xe];
    local_108[0xf] = (RTCHitN)auVar45[0xf];
    uStack_e4 = local_e8;
    uStack_e0 = local_e8;
    uStack_dc = local_e8;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    local_2b8 = auVar57._0_8_;
    uStack_2b0 = auVar57._8_8_;
    local_b8 = local_2b8;
    uStack_b0 = uStack_2b0;
    local_a8 = auVar64;
    vpcmpeqd_avx2(ZEXT1632(auVar64),ZEXT1632(auVar64));
    uStack_94 = context->user->instID[0];
    local_98 = uStack_94;
    uStack_90 = uStack_94;
    uStack_8c = uStack_94;
    uStack_88 = context->user->instPrimID[0];
    uStack_84 = uStack_88;
    uStack_80 = uStack_88;
    uStack_7c = uStack_88;
    *(float *)(ray + k * 4 + 0x80) = auVar76._0_4_;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar8->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_108;
    args.N = 4;
    local_378 = auVar12;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&args);
      auVar240 = ZEXT3264(_DAT_01fb9fe0);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar239 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar238 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar236 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar235 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar234 = ZEXT1664(auVar45);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar241 = ZEXT3264(auVar87);
    }
    uVar30 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar30 & 0xf) == 0) {
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar237 = ZEXT3264(auVar87);
      auVar45 = vxorps_avx512vl(auVar77,auVar77);
      auVar242 = ZEXT1664(auVar45);
    }
    else {
      p_Var9 = context->args->filter;
      if (p_Var9 == (RTCFilterFunctionN)0x0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar237 = ZEXT3264(auVar87);
        auVar45 = vxorps_avx512vl(auVar77,auVar77);
        auVar242 = ZEXT1664(auVar45);
      }
      else {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar237 = ZEXT3264(auVar87);
        auVar45 = vxorps_avx512vl(auVar77,auVar77);
        auVar242 = ZEXT1664(auVar45);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var9)(&args);
          auVar45 = vxorps_avx512vl(auVar45,auVar45);
          auVar242 = ZEXT1664(auVar45);
          auVar240 = ZEXT3264(_DAT_01fb9fe0);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar239 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar238 = ZEXT1664(auVar45);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar237 = ZEXT3264(auVar87);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar236 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar235 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar234 = ZEXT1664(auVar45);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar241 = ZEXT3264(auVar87);
        }
      }
      auVar243 = ZEXT464(0x3f800000);
      uVar30 = vptestmd_avx512vl(local_378,local_378);
      uVar30 = uVar30 & 0xf;
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar35 = (bool)((byte)uVar30 & 1);
      bVar36 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar33 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar34 = SUB81(uVar30 >> 3,0);
      *(uint *)(args.ray + 0x80) =
           (uint)bVar35 * auVar45._0_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x80);
      *(uint *)(args.ray + 0x84) =
           (uint)bVar36 * auVar45._4_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x84);
      *(uint *)(args.ray + 0x88) =
           (uint)bVar33 * auVar45._8_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x88);
      *(uint *)(args.ray + 0x8c) =
           (uint)bVar34 * auVar45._12_4_ | (uint)!bVar34 * *(int *)(args.ray + 0x8c);
      bVar24 = 1;
      if ((byte)uVar30 != 0) goto LAB_019c5aca;
    }
    auVar243 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x80) = fVar206;
  }
  bVar24 = 0;
LAB_019c5aca:
  bVar31 = (bool)(bVar31 | bVar24);
  goto LAB_019c4c20;
LAB_019c5ad2:
  auVar76 = vinsertps_avx(auVar146,auVar69,0x10);
  goto LAB_019c4725;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }